

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  ulong uVar83;
  RayK<8> *pRVar84;
  byte bVar85;
  bool bVar86;
  ulong uVar87;
  uint uVar88;
  ulong uVar89;
  Geometry *geometry;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  long lVar90;
  float fVar91;
  float fVar92;
  float fVar139;
  float fVar140;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar96 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar97 [16];
  float fVar141;
  float fVar143;
  float fVar144;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar142;
  float fVar145;
  float fVar146;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar147;
  undefined4 uVar148;
  undefined8 uVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [64];
  float fVar159;
  float fVar160;
  float fVar169;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar170;
  float fVar177;
  float fVar178;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  uint uVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7b9;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined8 uStack_6d8;
  ulong local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  LinearSpace3fa *local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  int local_45c;
  undefined1 local_450 [16];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  byte local_410;
  float local_400 [4];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar83 = (ulong)(byte)PVar12;
  fVar170 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar24 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar24 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar157 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar96 = vsubps_avx(auVar24,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  fVar159 = fVar170 * auVar96._0_4_;
  fVar147 = fVar170 * auVar157._0_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar24);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar95);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar103 = vpmovsxbd_avx2(auVar94);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar115 = vpmovsxbd_avx2(auVar8);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar118 = vpmovsxbd_avx2(auVar9);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar83 + 6);
  auVar117 = vpmovsxbd_avx2(auVar203);
  auVar117 = vcvtdq2ps_avx(auVar117);
  uVar89 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar116 = vpmovsxbd_avx2(auVar93);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar89 + uVar83 + 6);
  auVar107 = vpmovsxbd_avx2(auVar10);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar105 = vcvtdq2ps_avx(auVar107);
  uVar87 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar87 + 6);
  auVar100 = vpmovsxbd_avx2(auVar11);
  auVar106 = vcvtdq2ps_avx(auVar100);
  auVar194._4_4_ = fVar147;
  auVar194._0_4_ = fVar147;
  auVar194._8_4_ = fVar147;
  auVar194._12_4_ = fVar147;
  auVar194._16_4_ = fVar147;
  auVar194._20_4_ = fVar147;
  auVar194._24_4_ = fVar147;
  auVar194._28_4_ = fVar147;
  auVar197._8_4_ = 1;
  auVar197._0_8_ = 0x100000001;
  auVar197._12_4_ = 1;
  auVar197._16_4_ = 1;
  auVar197._20_4_ = 1;
  auVar197._24_4_ = 1;
  auVar197._28_4_ = 1;
  auVar108 = ZEXT1632(CONCAT412(fVar170 * auVar157._12_4_,
                                CONCAT48(fVar170 * auVar157._8_4_,
                                         CONCAT44(fVar170 * auVar157._4_4_,fVar147))));
  auVar101 = vpermps_avx2(auVar197,auVar108);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = vpermps_avx512vl(auVar98,auVar108);
  fVar147 = auVar99._0_4_;
  fVar177 = auVar99._4_4_;
  auVar108._4_4_ = fVar177 * auVar103._4_4_;
  auVar108._0_4_ = fVar147 * auVar103._0_4_;
  fVar178 = auVar99._8_4_;
  auVar108._8_4_ = fVar178 * auVar103._8_4_;
  fVar160 = auVar99._12_4_;
  auVar108._12_4_ = fVar160 * auVar103._12_4_;
  fVar169 = auVar99._16_4_;
  auVar108._16_4_ = fVar169 * auVar103._16_4_;
  fVar91 = auVar99._20_4_;
  auVar108._20_4_ = fVar91 * auVar103._20_4_;
  fVar92 = auVar99._24_4_;
  auVar108._24_4_ = fVar92 * auVar103._24_4_;
  auVar108._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar117._4_4_ * fVar177;
  auVar107._0_4_ = auVar117._0_4_ * fVar147;
  auVar107._8_4_ = auVar117._8_4_ * fVar178;
  auVar107._12_4_ = auVar117._12_4_ * fVar160;
  auVar107._16_4_ = auVar117._16_4_ * fVar169;
  auVar107._20_4_ = auVar117._20_4_ * fVar91;
  auVar107._24_4_ = auVar117._24_4_ * fVar92;
  auVar107._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar106._4_4_ * fVar177;
  auVar100._0_4_ = auVar106._0_4_ * fVar147;
  auVar100._8_4_ = auVar106._8_4_ * fVar178;
  auVar100._12_4_ = auVar106._12_4_ * fVar160;
  auVar100._16_4_ = auVar106._16_4_ * fVar169;
  auVar100._20_4_ = auVar106._20_4_ * fVar91;
  auVar100._24_4_ = auVar106._24_4_ * fVar92;
  auVar100._28_4_ = auVar99._28_4_;
  auVar24 = vfmadd231ps_fma(auVar108,auVar101,auVar102);
  auVar95 = vfmadd231ps_fma(auVar107,auVar101,auVar118);
  auVar94 = vfmadd231ps_fma(auVar100,auVar105,auVar101);
  auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar194,auVar104);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar194,auVar115);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar116,auVar194);
  auVar195._4_4_ = fVar159;
  auVar195._0_4_ = fVar159;
  auVar195._8_4_ = fVar159;
  auVar195._12_4_ = fVar159;
  auVar195._16_4_ = fVar159;
  auVar195._20_4_ = fVar159;
  auVar195._24_4_ = fVar159;
  auVar195._28_4_ = fVar159;
  auVar100 = ZEXT1632(CONCAT412(fVar170 * auVar96._12_4_,
                                CONCAT48(fVar170 * auVar96._8_4_,
                                         CONCAT44(fVar170 * auVar96._4_4_,fVar159))));
  auVar107 = vpermps_avx2(auVar197,auVar100);
  auVar100 = vpermps_avx512vl(auVar98,auVar100);
  auVar101 = vmulps_avx512vl(auVar100,auVar103);
  auVar110._0_4_ = auVar100._0_4_ * auVar117._0_4_;
  auVar110._4_4_ = auVar100._4_4_ * auVar117._4_4_;
  auVar110._8_4_ = auVar100._8_4_ * auVar117._8_4_;
  auVar110._12_4_ = auVar100._12_4_ * auVar117._12_4_;
  auVar110._16_4_ = auVar100._16_4_ * auVar117._16_4_;
  auVar110._20_4_ = auVar100._20_4_ * auVar117._20_4_;
  auVar110._24_4_ = auVar100._24_4_ * auVar117._24_4_;
  auVar110._28_4_ = 0;
  auVar117._4_4_ = auVar100._4_4_ * auVar106._4_4_;
  auVar117._0_4_ = auVar100._0_4_ * auVar106._0_4_;
  auVar117._8_4_ = auVar100._8_4_ * auVar106._8_4_;
  auVar117._12_4_ = auVar100._12_4_ * auVar106._12_4_;
  auVar117._16_4_ = auVar100._16_4_ * auVar106._16_4_;
  auVar117._20_4_ = auVar100._20_4_ * auVar106._20_4_;
  auVar117._24_4_ = auVar100._24_4_ * auVar106._24_4_;
  auVar117._28_4_ = auVar103._28_4_;
  auVar102 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar102);
  auVar8 = vfmadd231ps_fma(auVar110,auVar107,auVar118);
  auVar9 = vfmadd231ps_fma(auVar117,auVar107,auVar105);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar195,auVar104);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar195,auVar115);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar195,auVar116);
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  auVar104 = vandps_avx(ZEXT1632(auVar24),auVar114);
  auVar112._8_4_ = 0x219392ef;
  auVar112._0_8_ = 0x219392ef219392ef;
  auVar112._12_4_ = 0x219392ef;
  auVar112._16_4_ = 0x219392ef;
  auVar112._20_4_ = 0x219392ef;
  auVar112._24_4_ = 0x219392ef;
  auVar112._28_4_ = 0x219392ef;
  uVar89 = vcmpps_avx512vl(auVar104,auVar112,1);
  bVar86 = (bool)((byte)uVar89 & 1);
  auVar101._0_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar24._0_4_;
  bVar86 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar24._4_4_;
  bVar86 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar24._8_4_;
  bVar86 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar24._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar95),auVar114);
  uVar89 = vcmpps_avx512vl(auVar104,auVar112,1);
  bVar86 = (bool)((byte)uVar89 & 1);
  auVar98._0_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar95._0_4_;
  bVar86 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar95._4_4_;
  bVar86 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar95._8_4_;
  bVar86 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar95._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar94),auVar114);
  uVar89 = vcmpps_avx512vl(auVar104,auVar112,1);
  bVar86 = (bool)((byte)uVar89 & 1);
  auVar104._0_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar94._0_4_;
  bVar86 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar94._4_4_;
  bVar86 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar94._8_4_;
  bVar86 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar94._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar103 = vrcp14ps_avx512vl(auVar101);
  auVar113._8_4_ = 0x3f800000;
  auVar113._0_8_ = &DAT_3f8000003f800000;
  auVar113._12_4_ = 0x3f800000;
  auVar113._16_4_ = 0x3f800000;
  auVar113._20_4_ = 0x3f800000;
  auVar113._24_4_ = 0x3f800000;
  auVar113._28_4_ = 0x3f800000;
  auVar24 = vfnmadd213ps_fma(auVar101,auVar103,auVar113);
  auVar24 = vfmadd132ps_fma(ZEXT1632(auVar24),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar98);
  auVar95 = vfnmadd213ps_fma(auVar98,auVar103,auVar113);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar104);
  auVar94 = vfnmadd213ps_fma(auVar104,auVar103,auVar113);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar103,auVar103);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vsubps_avx512vl(auVar104,auVar102);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar116._4_4_ = auVar24._4_4_ * auVar103._4_4_;
  auVar116._0_4_ = auVar24._0_4_ * auVar103._0_4_;
  auVar116._8_4_ = auVar24._8_4_ * auVar103._8_4_;
  auVar116._12_4_ = auVar24._12_4_ * auVar103._12_4_;
  auVar116._16_4_ = auVar103._16_4_ * 0.0;
  auVar116._20_4_ = auVar103._20_4_ * 0.0;
  auVar116._24_4_ = auVar103._24_4_ * 0.0;
  auVar116._28_4_ = auVar103._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx512vl(auVar104,auVar102);
  auVar111._0_4_ = auVar24._0_4_ * auVar104._0_4_;
  auVar111._4_4_ = auVar24._4_4_ * auVar104._4_4_;
  auVar111._8_4_ = auVar24._8_4_ * auVar104._8_4_;
  auVar111._12_4_ = auVar24._12_4_ * auVar104._12_4_;
  auVar111._16_4_ = auVar104._16_4_ * 0.0;
  auVar111._20_4_ = auVar104._20_4_ * 0.0;
  auVar111._24_4_ = auVar104._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar12 * 0x10 + uVar83 * -2 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar8));
  auVar105._4_4_ = auVar95._4_4_ * auVar104._4_4_;
  auVar105._0_4_ = auVar95._0_4_ * auVar104._0_4_;
  auVar105._8_4_ = auVar95._8_4_ * auVar104._8_4_;
  auVar105._12_4_ = auVar95._12_4_ * auVar104._12_4_;
  auVar105._16_4_ = auVar104._16_4_ * 0.0;
  auVar105._20_4_ = auVar104._20_4_ * 0.0;
  auVar105._24_4_ = auVar104._24_4_ * 0.0;
  auVar105._28_4_ = auVar104._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar102);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar8));
  auVar109._0_4_ = auVar95._0_4_ * auVar104._0_4_;
  auVar109._4_4_ = auVar95._4_4_ * auVar104._4_4_;
  auVar109._8_4_ = auVar95._8_4_ * auVar104._8_4_;
  auVar109._12_4_ = auVar95._12_4_ * auVar104._12_4_;
  auVar109._16_4_ = auVar104._16_4_ * 0.0;
  auVar109._20_4_ = auVar104._20_4_ * 0.0;
  auVar109._24_4_ = auVar104._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 + uVar83 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar9));
  auVar106._4_4_ = auVar104._4_4_ * auVar94._4_4_;
  auVar106._0_4_ = auVar104._0_4_ * auVar94._0_4_;
  auVar106._8_4_ = auVar104._8_4_ * auVar94._8_4_;
  auVar106._12_4_ = auVar104._12_4_ * auVar94._12_4_;
  auVar106._16_4_ = auVar104._16_4_ * 0.0;
  auVar106._20_4_ = auVar104._20_4_ * 0.0;
  auVar106._24_4_ = auVar104._24_4_ * 0.0;
  auVar106._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar9));
  auVar99._0_4_ = auVar94._0_4_ * auVar104._0_4_;
  auVar99._4_4_ = auVar94._4_4_ * auVar104._4_4_;
  auVar99._8_4_ = auVar94._8_4_ * auVar104._8_4_;
  auVar99._12_4_ = auVar94._12_4_ * auVar104._12_4_;
  auVar99._16_4_ = auVar104._16_4_ * 0.0;
  auVar99._20_4_ = auVar104._20_4_ * 0.0;
  auVar99._24_4_ = auVar104._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar104 = vpminsd_avx2(auVar116,auVar111);
  auVar102 = vpminsd_avx2(auVar105,auVar109);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102 = vpminsd_avx2(auVar106,auVar99);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar103._4_4_ = uVar148;
  auVar103._0_4_ = uVar148;
  auVar103._8_4_ = uVar148;
  auVar103._12_4_ = uVar148;
  auVar103._16_4_ = uVar148;
  auVar103._20_4_ = uVar148;
  auVar103._24_4_ = uVar148;
  auVar103._28_4_ = uVar148;
  auVar102 = vmaxps_avx512vl(auVar102,auVar103);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar104,auVar102);
  auVar185 = ZEXT3264(local_80);
  auVar104 = vpmaxsd_avx2(auVar116,auVar111);
  auVar158 = ZEXT3264(auVar104);
  auVar102 = vpmaxsd_avx2(auVar105,auVar109);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar102 = vpmaxsd_avx2(auVar106,auVar99);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar115._4_4_ = uVar148;
  auVar115._0_4_ = uVar148;
  auVar115._8_4_ = uVar148;
  auVar115._12_4_ = uVar148;
  auVar115._16_4_ = uVar148;
  auVar115._20_4_ = uVar148;
  auVar115._24_4_ = uVar148;
  auVar115._28_4_ = uVar148;
  auVar102 = vminps_avx512vl(auVar102,auVar115);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar118._8_4_ = 0x3f800003;
  auVar118._0_8_ = 0x3f8000033f800003;
  auVar118._12_4_ = 0x3f800003;
  auVar118._16_4_ = 0x3f800003;
  auVar118._20_4_ = 0x3f800003;
  auVar118._24_4_ = 0x3f800003;
  auVar118._28_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar118);
  auVar102 = vpbroadcastd_avx512vl();
  uVar25 = vpcmpgtd_avx512vl(auVar102,_DAT_0205a920);
  uVar149 = vcmpps_avx512vl(local_80,auVar104,2);
  local_7b9 = (byte)((byte)uVar149 & (byte)uVar25) != 0;
  if (local_7b9) {
    uVar89 = (ulong)(byte)((byte)uVar149 & (byte)uVar25);
    local_648 = pre->ray_space + k;
    local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar104 = local_4e0;
      auVar103 = auVar185._0_32_;
      auVar102 = auVar158._0_32_;
      local_5e0 = in_ZMM21._0_32_;
      local_5c0 = in_ZMM20._0_32_;
      lVar26 = 0;
      for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar88 = *(uint *)(prim + 2);
      pGVar14 = (context->scene->geometries).items[uVar88].ptr;
      uVar83 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                               pGVar14[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar26 * 4 + 6));
      p_Var15 = pGVar14[1].intersectionFilterN;
      lVar26 = *(long *)&pGVar14[1].time_range.upper;
      auVar24 = *(undefined1 (*) [16])(lVar26 + (long)p_Var15 * uVar83);
      pauVar3 = (undefined1 (*) [16])(lVar26 + (uVar83 + 1) * (long)p_Var15);
      local_6d0 = *(ulong *)*pauVar3;
      uStack_6a8 = *(undefined8 *)(*pauVar3 + 8);
      auVar95 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar26 + (uVar83 + 2) * (long)p_Var15);
      local_6c0 = *(undefined8 *)*pauVar4;
      uStack_6b8 = *(undefined8 *)(*pauVar4 + 8);
      auVar94 = *pauVar4;
      uVar89 = uVar89 - 1 & uVar89;
      pauVar5 = (undefined1 (*) [16])(lVar26 + (uVar83 + 3) * (long)p_Var15);
      local_660 = *(undefined8 *)*pauVar5;
      uStack_658 = *(undefined8 *)(*pauVar5 + 8);
      auVar8 = *pauVar5;
      if (uVar89 != 0) {
        uVar87 = uVar89 - 1 & uVar89;
        for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        }
        if (uVar87 != 0) {
          for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar93 = vsubps_avx(auVar24,auVar9);
      uVar148 = auVar93._0_4_;
      auVar157._4_4_ = uVar148;
      auVar157._0_4_ = uVar148;
      auVar157._8_4_ = uVar148;
      auVar157._12_4_ = uVar148;
      auVar203 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      aVar6 = (local_648->vx).field_0;
      aVar7 = (local_648->vy).field_0;
      fVar170 = (local_648->vz).field_0.m128[0];
      fVar147 = *(float *)((long)&(local_648->vz).field_0 + 4);
      fVar177 = *(float *)((long)&(local_648->vz).field_0 + 8);
      fVar178 = *(float *)((long)&(local_648->vz).field_0 + 0xc);
      auVar97._0_4_ = fVar170 * auVar93._0_4_;
      auVar97._4_4_ = fVar147 * auVar93._4_4_;
      auVar97._8_4_ = fVar177 * auVar93._8_4_;
      auVar97._12_4_ = fVar178 * auVar93._12_4_;
      auVar203 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar7,auVar203);
      auVar11 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar157);
      auVar203 = vshufps_avx(auVar24,auVar24,0xff);
      auVar10 = vsubps_avx(auVar95,auVar9);
      uVar148 = auVar10._0_4_;
      auVar96._4_4_ = uVar148;
      auVar96._0_4_ = uVar148;
      auVar96._8_4_ = uVar148;
      auVar96._12_4_ = uVar148;
      auVar93 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar188._0_4_ = fVar170 * auVar10._0_4_;
      auVar188._4_4_ = fVar147 * auVar10._4_4_;
      auVar188._8_4_ = fVar177 * auVar10._8_4_;
      auVar188._12_4_ = fVar178 * auVar10._12_4_;
      auVar93 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar7,auVar93);
      auVar157 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar6,auVar96);
      auVar95 = vshufps_avx(auVar95,auVar95,0xff);
      auVar10 = vsubps_avx(auVar94,auVar9);
      uVar148 = auVar10._0_4_;
      auVar186._4_4_ = uVar148;
      auVar186._0_4_ = uVar148;
      auVar186._8_4_ = uVar148;
      auVar186._12_4_ = uVar148;
      auVar93 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar191._0_4_ = fVar170 * auVar10._0_4_;
      auVar191._4_4_ = fVar147 * auVar10._4_4_;
      auVar191._8_4_ = fVar177 * auVar10._8_4_;
      auVar191._12_4_ = fVar178 * auVar10._12_4_;
      auVar93 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar7,auVar93);
      auVar10 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar6,auVar186);
      auVar94 = vshufps_avx(auVar94,auVar94,0xff);
      auVar93 = vsubps_avx512vl(auVar8,auVar9);
      uVar148 = auVar93._0_4_;
      auVar161._4_4_ = uVar148;
      auVar161._0_4_ = uVar148;
      auVar161._8_4_ = uVar148;
      auVar161._12_4_ = uVar148;
      auVar9 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar192._0_4_ = fVar170 * auVar93._0_4_;
      auVar192._4_4_ = fVar147 * auVar93._4_4_;
      auVar192._8_4_ = fVar177 * auVar93._8_4_;
      auVar192._12_4_ = fVar178 * auVar93._12_4_;
      auVar9 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar9);
      auVar9 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar6,auVar161);
      lVar26 = (long)iVar13 * 0x44;
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26);
      auVar93 = vshufps_avx512vl(auVar8,auVar8,0xff);
      local_560 = vbroadcastss_avx512vl(auVar11);
      auVar166._8_4_ = 1;
      auVar166._0_8_ = 0x100000001;
      auVar166._12_4_ = 1;
      auVar166._16_4_ = 1;
      auVar166._20_4_ = 1;
      auVar166._24_4_ = 1;
      auVar166._28_4_ = 1;
      local_580 = vpermps_avx512vl(auVar166,ZEXT1632(auVar11));
      uVar149 = auVar203._0_8_;
      local_a0._8_8_ = uVar149;
      local_a0._0_8_ = uVar149;
      local_a0._16_8_ = uVar149;
      local_a0._24_8_ = uVar149;
      auVar118 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x484);
      uVar148 = auVar157._0_4_;
      local_6a0._4_4_ = uVar148;
      local_6a0._0_4_ = uVar148;
      local_6a0._8_4_ = uVar148;
      local_6a0._12_4_ = uVar148;
      local_6a0._16_4_ = uVar148;
      local_6a0._20_4_ = uVar148;
      local_6a0._24_4_ = uVar148;
      local_6a0._28_4_ = uVar148;
      local_2e0 = vpermps_avx512vl(auVar166,ZEXT1632(auVar157));
      local_c0 = vbroadcastsd_avx512vl(auVar95);
      auVar117 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x908);
      local_e0 = vbroadcastss_avx512vl(auVar10);
      local_100 = vpermps_avx512vl(auVar166,ZEXT1632(auVar10));
      local_120 = vbroadcastsd_avx512vl(auVar94);
      auVar116 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar9);
      auVar205 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar166,ZEXT1632(auVar9));
      uVar149 = auVar93._0_8_;
      register0x000012c8 = uVar149;
      local_140 = uVar149;
      register0x000012d0 = uVar149;
      register0x000012d8 = uVar149;
      auVar105 = vmulps_avx512vl(local_600,auVar116);
      auVar106 = vmulps_avx512vl(local_620,auVar116);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar117,local_e0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar117,local_100);
      auVar95 = vfmadd231ps_fma(auVar105,auVar118,local_6a0);
      auVar107 = vfmadd231ps_avx512vl(auVar106,auVar118,local_2e0);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar115,local_560);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x484);
      auVar108 = vfmadd231ps_avx512vl(auVar107,auVar115,local_580);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x908);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0xd8c);
      auVar98 = vmulps_avx512vl(local_600,auVar100);
      auVar99 = vmulps_avx512vl(local_620,auVar100);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_100);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar106,local_6a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_2e0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_560);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_580);
      auVar109 = vsubps_avx512vl(auVar98,auVar101);
      auVar110 = vsubps_avx512vl(auVar99,auVar108);
      auVar111 = vmulps_avx512vl(auVar108,auVar109);
      auVar112 = vmulps_avx512vl(auVar101,auVar110);
      auVar111 = vsubps_avx512vl(auVar111,auVar112);
      auVar112 = vmulps_avx512vl(_local_140,auVar116);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,local_120);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_c0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_a0);
      auVar113 = vmulps_avx512vl(_local_140,auVar100);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar107,local_120);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar106,local_c0);
      auVar203 = vfmadd231ps_fma(auVar113,auVar105,local_a0);
      auVar113 = vmulps_avx512vl(auVar110,auVar110);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar109);
      auVar114 = vmaxps_avx512vl(auVar112,ZEXT1632(auVar203));
      auVar114 = vmulps_avx512vl(auVar114,auVar114);
      auVar113 = vmulps_avx512vl(auVar114,auVar113);
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      uVar149 = vcmpps_avx512vl(auVar111,auVar113,2);
      auVar95 = vblendps_avx(auVar11,auVar24,8);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar94 = vandps_avx512vl(auVar95,auVar93);
      auVar95 = vblendps_avx(auVar157,*pauVar3,8);
      auVar95 = vandps_avx512vl(auVar95,auVar93);
      auVar94 = vmaxps_avx(auVar94,auVar95);
      auVar95 = vblendps_avx(auVar10,*pauVar4,8);
      auVar96 = vandps_avx512vl(auVar95,auVar93);
      auVar95 = vblendps_avx(auVar9,auVar8,8);
      auVar95 = vandps_avx512vl(auVar95,auVar93);
      auVar95 = vmaxps_avx(auVar96,auVar95);
      auVar95 = vmaxps_avx(auVar94,auVar95);
      auVar94 = vmovshdup_avx(auVar95);
      auVar94 = vmaxss_avx(auVar94,auVar95);
      auVar95 = vshufpd_avx(auVar95,auVar95,1);
      auVar95 = vmaxss_avx(auVar95,auVar94);
      auVar193._0_4_ = (float)iVar13;
      local_4e0._4_12_ = auVar11._4_12_;
      local_4e0._0_4_ = auVar193._0_4_;
      local_4e0._16_16_ = auVar104._16_16_;
      auVar193._4_4_ = auVar193._0_4_;
      auVar193._8_4_ = auVar193._0_4_;
      auVar193._12_4_ = auVar193._0_4_;
      auVar193._16_4_ = auVar193._0_4_;
      auVar193._20_4_ = auVar193._0_4_;
      auVar193._24_4_ = auVar193._0_4_;
      auVar193._28_4_ = auVar193._0_4_;
      uVar25 = vcmpps_avx512vl(auVar193,_DAT_02020f40,0xe);
      local_410 = (byte)uVar149 & (byte)uVar25;
      local_500 = auVar95._0_4_ * 4.7683716e-07;
      auVar167._8_4_ = 2;
      auVar167._0_8_ = 0x200000002;
      auVar167._12_4_ = 2;
      auVar167._16_4_ = 2;
      auVar167._20_4_ = 2;
      auVar167._24_4_ = 2;
      auVar167._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar167,ZEXT1632(auVar11));
      local_180 = vpermps_avx512vl(auVar167,ZEXT1632(auVar157));
      local_1a0 = vpermps_avx512vl(auVar167,ZEXT1632(auVar10));
      local_5a0 = vpermps_avx2(auVar167,ZEXT1632(auVar9));
      uVar190 = *(uint *)(ray + k * 4 + 0x60);
      auVar95 = auVar109._0_16_;
      local_700 = ZEXT416((uint)local_500);
      local_6b0 = local_6d0;
      if (local_410 == 0) {
        bVar86 = false;
        auVar95 = vxorps_avx512vl(auVar95,auVar95);
        auVar204 = ZEXT1664(auVar95);
        auVar185 = ZEXT3264(auVar103);
        in_ZMM20 = ZEXT3264(local_5c0);
        auVar158 = ZEXT3264(auVar102);
        in_ZMM21 = ZEXT3264(local_5e0);
        auVar202 = ZEXT3264(local_560);
        auVar201 = ZEXT3264(local_580);
        auVar200 = ZEXT3264(local_6a0);
        auVar206 = ZEXT3264(local_620);
      }
      else {
        local_640._0_16_ = ZEXT416(uVar190);
        auVar104 = vmulps_avx512vl(local_5a0,auVar100);
        auVar104 = vfmadd213ps_avx512vl(auVar107,local_1a0,auVar104);
        auVar104 = vfmadd213ps_avx512vl(auVar106,local_180,auVar104);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_160,auVar104);
        auVar104 = vmulps_avx512vl(local_5a0,auVar116);
        auVar104 = vfmadd213ps_avx512vl(auVar117,local_1a0,auVar104);
        auVar106 = vfmadd213ps_avx512vl(auVar118,local_180,auVar104);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1210);
        auVar118 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1694);
        auVar117 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1b18);
        auVar116 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1f9c);
        auVar106 = vfmadd213ps_avx512vl(auVar115,local_160,auVar106);
        auVar115 = vmulps_avx512vl(local_600,auVar116);
        auVar107 = vmulps_avx512vl(local_620,auVar116);
        auVar36._4_4_ = local_5a0._4_4_ * auVar116._4_4_;
        auVar36._0_4_ = local_5a0._0_4_ * auVar116._0_4_;
        auVar36._8_4_ = local_5a0._8_4_ * auVar116._8_4_;
        auVar36._12_4_ = local_5a0._12_4_ * auVar116._12_4_;
        auVar36._16_4_ = local_5a0._16_4_ * auVar116._16_4_;
        auVar36._20_4_ = local_5a0._20_4_ * auVar116._20_4_;
        auVar36._24_4_ = local_5a0._24_4_ * auVar116._24_4_;
        auVar36._28_4_ = auVar116._28_4_;
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,local_e0);
        auVar116 = vfmadd231ps_avx512vl(auVar107,auVar117,local_100);
        auVar117 = vfmadd231ps_avx512vl(auVar36,local_1a0,auVar117);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar118,local_6a0);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar118,local_2e0);
        auVar107 = vfmadd231ps_avx512vl(auVar117,local_180,auVar118);
        auVar100 = vfmadd231ps_avx512vl(auVar115,auVar104,local_560);
        auVar201 = ZEXT3264(local_580);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar104,local_580);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1210);
        auVar118 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1b18);
        auVar117 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1f9c);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_160,auVar104);
        auVar104 = vmulps_avx512vl(local_600,auVar117);
        auVar111 = vmulps_avx512vl(local_620,auVar117);
        auVar37._4_4_ = local_5a0._4_4_ * auVar117._4_4_;
        auVar37._0_4_ = local_5a0._0_4_ * auVar117._0_4_;
        auVar37._8_4_ = local_5a0._8_4_ * auVar117._8_4_;
        auVar37._12_4_ = local_5a0._12_4_ * auVar117._12_4_;
        auVar37._16_4_ = local_5a0._16_4_ * auVar117._16_4_;
        auVar37._20_4_ = local_5a0._20_4_ * auVar117._20_4_;
        auVar37._24_4_ = local_5a0._24_4_ * auVar117._24_4_;
        auVar37._28_4_ = auVar117._28_4_;
        auVar117 = vfmadd231ps_avx512vl(auVar104,auVar118,local_e0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,local_100);
        auVar118 = vfmadd231ps_avx512vl(auVar37,local_1a0,auVar118);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1694);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar104,local_6a0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar104,local_2e0);
        auVar104 = vfmadd231ps_avx512vl(auVar118,local_180,auVar104);
        auVar118 = vfmadd231ps_avx512vl(auVar117,auVar115,local_560);
        auVar117 = vfmadd231ps_avx512vl(auVar111,auVar115,local_580);
        auVar111 = vfmadd231ps_avx512vl(auVar104,local_160,auVar115);
        auVar198._8_4_ = 0x7fffffff;
        auVar198._0_8_ = 0x7fffffff7fffffff;
        auVar198._12_4_ = 0x7fffffff;
        auVar198._16_4_ = 0x7fffffff;
        auVar198._20_4_ = 0x7fffffff;
        auVar198._24_4_ = 0x7fffffff;
        auVar198._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(auVar100,auVar198);
        auVar115 = vandps_avx(auVar116,auVar198);
        auVar115 = vmaxps_avx(auVar104,auVar115);
        auVar104 = vandps_avx(auVar107,auVar198);
        auVar104 = vmaxps_avx(auVar115,auVar104);
        auVar107 = vbroadcastss_avx512vl(local_700);
        uVar83 = vcmpps_avx512vl(auVar104,auVar107,1);
        bVar86 = (bool)((byte)uVar83 & 1);
        auVar119._0_4_ = (float)((uint)bVar86 * auVar109._0_4_ | (uint)!bVar86 * auVar100._0_4_);
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar86 * auVar109._4_4_ | (uint)!bVar86 * auVar100._4_4_);
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar86 * auVar109._8_4_ | (uint)!bVar86 * auVar100._8_4_);
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar86 * auVar109._12_4_ | (uint)!bVar86 * auVar100._12_4_);
        bVar86 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar86 * auVar109._16_4_ | (uint)!bVar86 * auVar100._16_4_);
        bVar86 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar86 * auVar109._20_4_ | (uint)!bVar86 * auVar100._20_4_);
        bVar86 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar86 * auVar109._24_4_ | (uint)!bVar86 * auVar100._24_4_);
        bVar86 = SUB81(uVar83 >> 7,0);
        auVar119._28_4_ = (uint)bVar86 * auVar109._28_4_ | (uint)!bVar86 * auVar100._28_4_;
        bVar86 = (bool)((byte)uVar83 & 1);
        auVar120._0_4_ = (float)((uint)bVar86 * auVar110._0_4_ | (uint)!bVar86 * auVar116._0_4_);
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar86 * auVar110._4_4_ | (uint)!bVar86 * auVar116._4_4_);
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar86 * auVar110._8_4_ | (uint)!bVar86 * auVar116._8_4_);
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar86 * auVar110._12_4_ | (uint)!bVar86 * auVar116._12_4_);
        bVar86 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar86 * auVar110._16_4_ | (uint)!bVar86 * auVar116._16_4_);
        bVar86 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar86 * auVar110._20_4_ | (uint)!bVar86 * auVar116._20_4_);
        bVar86 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar86 * auVar110._24_4_ | (uint)!bVar86 * auVar116._24_4_);
        bVar86 = SUB81(uVar83 >> 7,0);
        auVar120._28_4_ = (uint)bVar86 * auVar110._28_4_ | (uint)!bVar86 * auVar116._28_4_;
        auVar104 = vandps_avx(auVar198,auVar118);
        auVar115 = vandps_avx(auVar117,auVar198);
        auVar115 = vmaxps_avx(auVar104,auVar115);
        auVar104 = vandps_avx(auVar111,auVar198);
        auVar104 = vmaxps_avx(auVar115,auVar104);
        uVar83 = vcmpps_avx512vl(auVar104,auVar107,1);
        bVar86 = (bool)((byte)uVar83 & 1);
        auVar121._0_4_ = (float)((uint)bVar86 * auVar109._0_4_ | (uint)!bVar86 * auVar118._0_4_);
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar86 * auVar109._4_4_ | (uint)!bVar86 * auVar118._4_4_);
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar86 * auVar109._8_4_ | (uint)!bVar86 * auVar118._8_4_);
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar86 * auVar109._12_4_ | (uint)!bVar86 * auVar118._12_4_);
        bVar86 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar86 * auVar109._16_4_ | (uint)!bVar86 * auVar118._16_4_);
        bVar86 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar86 * auVar109._20_4_ | (uint)!bVar86 * auVar118._20_4_);
        bVar86 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar86 * auVar109._24_4_ | (uint)!bVar86 * auVar118._24_4_);
        bVar86 = SUB81(uVar83 >> 7,0);
        auVar121._28_4_ = (uint)bVar86 * auVar109._28_4_ | (uint)!bVar86 * auVar118._28_4_;
        bVar86 = (bool)((byte)uVar83 & 1);
        auVar122._0_4_ = (float)((uint)bVar86 * auVar110._0_4_ | (uint)!bVar86 * auVar117._0_4_);
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar86 * auVar110._4_4_ | (uint)!bVar86 * auVar117._4_4_);
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar86 * auVar110._8_4_ | (uint)!bVar86 * auVar117._8_4_);
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar86 * auVar110._12_4_ | (uint)!bVar86 * auVar117._12_4_);
        bVar86 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar86 * auVar110._16_4_ | (uint)!bVar86 * auVar117._16_4_);
        bVar86 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar86 * auVar110._20_4_ | (uint)!bVar86 * auVar117._20_4_);
        bVar86 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar86 * auVar110._24_4_ | (uint)!bVar86 * auVar117._24_4_);
        bVar86 = SUB81(uVar83 >> 7,0);
        auVar122._28_4_ = (uint)bVar86 * auVar110._28_4_ | (uint)!bVar86 * auVar117._28_4_;
        auVar97 = vxorps_avx512vl(auVar95,auVar95);
        auVar204 = ZEXT1664(auVar97);
        auVar104 = vfmadd213ps_avx512vl(auVar119,auVar119,ZEXT1632(auVar97));
        auVar95 = vfmadd231ps_fma(auVar104,auVar120,auVar120);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar170 = auVar104._0_4_;
        fVar147 = auVar104._4_4_;
        fVar177 = auVar104._8_4_;
        fVar178 = auVar104._12_4_;
        fVar160 = auVar104._16_4_;
        fVar169 = auVar104._20_4_;
        fVar91 = auVar104._24_4_;
        auVar38._4_4_ = fVar147 * fVar147 * fVar147 * auVar95._4_4_ * -0.5;
        auVar38._0_4_ = fVar170 * fVar170 * fVar170 * auVar95._0_4_ * -0.5;
        auVar38._8_4_ = fVar177 * fVar177 * fVar177 * auVar95._8_4_ * -0.5;
        auVar38._12_4_ = fVar178 * fVar178 * fVar178 * auVar95._12_4_ * -0.5;
        auVar38._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar38._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar38._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar38._28_4_ = 0;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar118 = vfmadd231ps_avx512vl(auVar38,auVar115,auVar104);
        auVar39._4_4_ = auVar120._4_4_ * auVar118._4_4_;
        auVar39._0_4_ = auVar120._0_4_ * auVar118._0_4_;
        auVar39._8_4_ = auVar120._8_4_ * auVar118._8_4_;
        auVar39._12_4_ = auVar120._12_4_ * auVar118._12_4_;
        auVar39._16_4_ = auVar120._16_4_ * auVar118._16_4_;
        auVar39._20_4_ = auVar120._20_4_ * auVar118._20_4_;
        auVar39._24_4_ = auVar120._24_4_ * auVar118._24_4_;
        auVar39._28_4_ = auVar104._28_4_;
        auVar40._4_4_ = auVar118._4_4_ * -auVar119._4_4_;
        auVar40._0_4_ = auVar118._0_4_ * -auVar119._0_4_;
        auVar40._8_4_ = auVar118._8_4_ * -auVar119._8_4_;
        auVar40._12_4_ = auVar118._12_4_ * -auVar119._12_4_;
        auVar40._16_4_ = auVar118._16_4_ * -auVar119._16_4_;
        auVar40._20_4_ = auVar118._20_4_ * -auVar119._20_4_;
        auVar40._24_4_ = auVar118._24_4_ * -auVar119._24_4_;
        auVar40._28_4_ = auVar119._28_4_ ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar118,ZEXT1632(auVar97));
        auVar100 = ZEXT1632(auVar97);
        auVar117 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar100);
        auVar95 = vfmadd231ps_fma(auVar117,auVar122,auVar122);
        auVar117 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar170 = auVar117._0_4_;
        fVar147 = auVar117._4_4_;
        fVar177 = auVar117._8_4_;
        fVar178 = auVar117._12_4_;
        fVar160 = auVar117._16_4_;
        fVar169 = auVar117._20_4_;
        fVar91 = auVar117._24_4_;
        auVar41._4_4_ = fVar147 * fVar147 * fVar147 * auVar95._4_4_ * -0.5;
        auVar41._0_4_ = fVar170 * fVar170 * fVar170 * auVar95._0_4_ * -0.5;
        auVar41._8_4_ = fVar177 * fVar177 * fVar177 * auVar95._8_4_ * -0.5;
        auVar41._12_4_ = fVar178 * fVar178 * fVar178 * auVar95._12_4_ * -0.5;
        auVar41._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar41._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar41._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar41._28_4_ = 0;
        auVar115 = vfmadd231ps_avx512vl(auVar41,auVar115,auVar117);
        auVar42._4_4_ = auVar122._4_4_ * auVar115._4_4_;
        auVar42._0_4_ = auVar122._0_4_ * auVar115._0_4_;
        auVar42._8_4_ = auVar122._8_4_ * auVar115._8_4_;
        auVar42._12_4_ = auVar122._12_4_ * auVar115._12_4_;
        auVar42._16_4_ = auVar122._16_4_ * auVar115._16_4_;
        auVar42._20_4_ = auVar122._20_4_ * auVar115._20_4_;
        auVar42._24_4_ = auVar122._24_4_ * auVar115._24_4_;
        auVar42._28_4_ = auVar117._28_4_;
        auVar43._4_4_ = -auVar121._4_4_ * auVar115._4_4_;
        auVar43._0_4_ = -auVar121._0_4_ * auVar115._0_4_;
        auVar43._8_4_ = -auVar121._8_4_ * auVar115._8_4_;
        auVar43._12_4_ = -auVar121._12_4_ * auVar115._12_4_;
        auVar43._16_4_ = -auVar121._16_4_ * auVar115._16_4_;
        auVar43._20_4_ = -auVar121._20_4_ * auVar115._20_4_;
        auVar43._24_4_ = -auVar121._24_4_ * auVar115._24_4_;
        auVar43._28_4_ = auVar118._28_4_;
        auVar115 = vmulps_avx512vl(auVar115,auVar100);
        auVar95 = vfmadd213ps_fma(auVar39,auVar112,auVar101);
        auVar94 = vfmadd213ps_fma(auVar40,auVar112,auVar108);
        auVar118 = vfmadd213ps_avx512vl(auVar104,auVar112,auVar106);
        auVar117 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar203),auVar98);
        auVar11 = vfnmadd213ps_fma(auVar39,auVar112,auVar101);
        auVar107 = ZEXT1632(auVar203);
        auVar8 = vfmadd213ps_fma(auVar43,auVar107,auVar99);
        auVar157 = vfnmadd213ps_fma(auVar40,auVar112,auVar108);
        auVar9 = vfmadd213ps_fma(auVar115,auVar107,auVar105);
        auVar116 = vfnmadd231ps_avx512vl(auVar106,auVar112,auVar104);
        auVar96 = vfnmadd213ps_fma(auVar42,auVar107,auVar98);
        auVar161 = vfnmadd213ps_fma(auVar43,auVar107,auVar99);
        auVar186 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar203),auVar115);
        auVar115 = vsubps_avx512vl(auVar117,ZEXT1632(auVar11));
        auVar104 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar157));
        auVar105 = vsubps_avx512vl(ZEXT1632(auVar9),auVar116);
        auVar106 = vmulps_avx512vl(auVar104,auVar116);
        auVar93 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar157),auVar105);
        auVar44._4_4_ = auVar11._4_4_ * auVar105._4_4_;
        auVar44._0_4_ = auVar11._0_4_ * auVar105._0_4_;
        auVar44._8_4_ = auVar11._8_4_ * auVar105._8_4_;
        auVar44._12_4_ = auVar11._12_4_ * auVar105._12_4_;
        auVar44._16_4_ = auVar105._16_4_ * 0.0;
        auVar44._20_4_ = auVar105._20_4_ * 0.0;
        auVar44._24_4_ = auVar105._24_4_ * 0.0;
        auVar44._28_4_ = auVar105._28_4_;
        auVar105 = vfmsub231ps_avx512vl(auVar44,auVar116,auVar115);
        auVar45._4_4_ = auVar157._4_4_ * auVar115._4_4_;
        auVar45._0_4_ = auVar157._0_4_ * auVar115._0_4_;
        auVar45._8_4_ = auVar157._8_4_ * auVar115._8_4_;
        auVar45._12_4_ = auVar157._12_4_ * auVar115._12_4_;
        auVar45._16_4_ = auVar115._16_4_ * 0.0;
        auVar45._20_4_ = auVar115._20_4_ * 0.0;
        auVar45._24_4_ = auVar115._24_4_ * 0.0;
        auVar45._28_4_ = auVar115._28_4_;
        auVar10 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar11),auVar104);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar100,auVar105);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar93));
        auVar98 = ZEXT1632(auVar97);
        uVar83 = vcmpps_avx512vl(auVar104,auVar98,2);
        bVar85 = (byte)uVar83;
        fVar91 = (float)((uint)(bVar85 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar96._0_4_);
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar159 = (float)((uint)bVar86 * auVar95._4_4_ | (uint)!bVar86 * auVar96._4_4_);
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar140 = (float)((uint)bVar86 * auVar95._8_4_ | (uint)!bVar86 * auVar96._8_4_);
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar143 = (float)((uint)bVar86 * auVar95._12_4_ | (uint)!bVar86 * auVar96._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar140,CONCAT44(fVar159,fVar91))));
        fVar92 = (float)((uint)(bVar85 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar161._0_4_);
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar139 = (float)((uint)bVar86 * auVar94._4_4_ | (uint)!bVar86 * auVar161._4_4_);
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar141 = (float)((uint)bVar86 * auVar94._8_4_ | (uint)!bVar86 * auVar161._8_4_);
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar144 = (float)((uint)bVar86 * auVar94._12_4_ | (uint)!bVar86 * auVar161._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar141,CONCAT44(fVar139,fVar92))));
        auVar123._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar118._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar186._0_4_);
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar86 * auVar118._4_4_ | (uint)!bVar86 * auVar186._4_4_);
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar86 * auVar118._8_4_ | (uint)!bVar86 * auVar186._8_4_);
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar86 * auVar118._12_4_ | (uint)!bVar86 * auVar186._12_4_);
        fVar170 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar118._16_4_);
        auVar123._16_4_ = fVar170;
        fVar147 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar118._20_4_);
        auVar123._20_4_ = fVar147;
        fVar177 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar118._24_4_);
        auVar123._24_4_ = fVar177;
        iVar1 = (uint)(byte)(uVar83 >> 7) * auVar118._28_4_;
        auVar123._28_4_ = iVar1;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar117);
        auVar124._0_4_ =
             (uint)(bVar85 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar93._0_4_;
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar86 * auVar115._4_4_ | (uint)!bVar86 * auVar93._4_4_;
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar86 * auVar115._8_4_ | (uint)!bVar86 * auVar93._8_4_;
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar86 * auVar115._12_4_ | (uint)!bVar86 * auVar93._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_;
        auVar124._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar157),ZEXT1632(auVar8));
        auVar125._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar94._0_4_
                    );
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar86 * auVar115._4_4_ | (uint)!bVar86 * auVar94._4_4_);
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar86 * auVar115._8_4_ | (uint)!bVar86 * auVar94._8_4_);
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar86 * auVar115._12_4_ | (uint)!bVar86 * auVar94._12_4_);
        fVar178 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_);
        auVar125._16_4_ = fVar178;
        fVar160 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_);
        auVar125._20_4_ = fVar160;
        fVar169 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_);
        auVar125._24_4_ = fVar169;
        auVar125._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(auVar116,ZEXT1632(auVar9));
        auVar126._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar118._0_4_);
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar86 * auVar115._4_4_ | (uint)!bVar86 * auVar118._4_4_);
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar86 * auVar115._8_4_ | (uint)!bVar86 * auVar118._8_4_);
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar86 * auVar115._12_4_ | (uint)!bVar86 * auVar118._12_4_);
        bVar86 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar86 * auVar115._16_4_ | (uint)!bVar86 * auVar118._16_4_);
        bVar86 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar86 * auVar115._20_4_ | (uint)!bVar86 * auVar118._20_4_);
        bVar86 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar86 * auVar115._24_4_ | (uint)!bVar86 * auVar118._24_4_);
        bVar86 = SUB81(uVar83 >> 7,0);
        auVar126._28_4_ = (uint)bVar86 * auVar115._28_4_ | (uint)!bVar86 * auVar118._28_4_;
        auVar127._0_4_ =
             (uint)(bVar85 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar117._0_4_;
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar86 * (int)auVar11._4_4_ | (uint)!bVar86 * auVar117._4_4_;
        bVar86 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar86 * (int)auVar11._8_4_ | (uint)!bVar86 * auVar117._8_4_;
        bVar86 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar86 * (int)auVar11._12_4_ | (uint)!bVar86 * auVar117._12_4_;
        auVar127._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar117._16_4_;
        auVar127._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar117._20_4_;
        auVar127._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar117._24_4_;
        auVar127._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar117._28_4_;
        bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar128._0_4_ =
             (uint)(bVar85 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar9._0_4_;
        bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * auVar9._4_4_;
        bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * auVar9._8_4_;
        bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * auVar9._12_4_;
        auVar128._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar116._16_4_;
        auVar128._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar116._20_4_;
        auVar128._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar116._24_4_;
        iVar2 = (uint)(byte)(uVar83 >> 7) * auVar116._28_4_;
        auVar128._28_4_ = iVar2;
        auVar100 = vsubps_avx512vl(auVar127,auVar106);
        auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar157._12_4_ |
                                                 (uint)!bVar18 * auVar8._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar157._8_4_ |
                                                          (uint)!bVar17 * auVar8._8_4_,
                                                          CONCAT44((uint)bVar86 *
                                                                   (int)auVar157._4_4_ |
                                                                   (uint)!bVar86 * auVar8._4_4_,
                                                                   (uint)(bVar85 & 1) *
                                                                   (int)auVar157._0_4_ |
                                                                   (uint)!(bool)(bVar85 & 1) *
                                                                   auVar8._0_4_)))),auVar107);
        auVar118 = vsubps_avx(auVar128,auVar123);
        auVar117 = vsubps_avx(auVar106,auVar124);
        auVar116 = vsubps_avx(auVar107,auVar125);
        auVar105 = vsubps_avx(auVar123,auVar126);
        auVar46._4_4_ = auVar118._4_4_ * fVar159;
        auVar46._0_4_ = auVar118._0_4_ * fVar91;
        auVar46._8_4_ = auVar118._8_4_ * fVar140;
        auVar46._12_4_ = auVar118._12_4_ * fVar143;
        auVar46._16_4_ = auVar118._16_4_ * 0.0;
        auVar46._20_4_ = auVar118._20_4_ * 0.0;
        auVar46._24_4_ = auVar118._24_4_ * 0.0;
        auVar46._28_4_ = iVar2;
        auVar95 = vfmsub231ps_fma(auVar46,auVar123,auVar100);
        auVar47._4_4_ = fVar139 * auVar100._4_4_;
        auVar47._0_4_ = fVar92 * auVar100._0_4_;
        auVar47._8_4_ = fVar141 * auVar100._8_4_;
        auVar47._12_4_ = fVar144 * auVar100._12_4_;
        auVar47._16_4_ = auVar100._16_4_ * 0.0;
        auVar47._20_4_ = auVar100._20_4_ * 0.0;
        auVar47._24_4_ = auVar100._24_4_ * 0.0;
        auVar47._28_4_ = auVar104._28_4_;
        auVar94 = vfmsub231ps_fma(auVar47,auVar106,auVar115);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar98,ZEXT1632(auVar95));
        auVar171._0_4_ = auVar115._0_4_ * auVar123._0_4_;
        auVar171._4_4_ = auVar115._4_4_ * auVar123._4_4_;
        auVar171._8_4_ = auVar115._8_4_ * auVar123._8_4_;
        auVar171._12_4_ = auVar115._12_4_ * auVar123._12_4_;
        auVar171._16_4_ = auVar115._16_4_ * fVar170;
        auVar171._20_4_ = auVar115._20_4_ * fVar147;
        auVar171._24_4_ = auVar115._24_4_ * fVar177;
        auVar171._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar171,auVar107,auVar118);
        auVar101 = vfmadd231ps_avx512vl(auVar104,auVar98,ZEXT1632(auVar95));
        auVar104 = vmulps_avx512vl(auVar105,auVar124);
        auVar104 = vfmsub231ps_avx512vl(auVar104,auVar117,auVar126);
        auVar48._4_4_ = auVar116._4_4_ * auVar126._4_4_;
        auVar48._0_4_ = auVar116._0_4_ * auVar126._0_4_;
        auVar48._8_4_ = auVar116._8_4_ * auVar126._8_4_;
        auVar48._12_4_ = auVar116._12_4_ * auVar126._12_4_;
        auVar48._16_4_ = auVar116._16_4_ * auVar126._16_4_;
        auVar48._20_4_ = auVar116._20_4_ * auVar126._20_4_;
        auVar48._24_4_ = auVar116._24_4_ * auVar126._24_4_;
        auVar48._28_4_ = auVar126._28_4_;
        auVar95 = vfmsub231ps_fma(auVar48,auVar125,auVar105);
        auVar172._0_4_ = auVar125._0_4_ * auVar117._0_4_;
        auVar172._4_4_ = auVar125._4_4_ * auVar117._4_4_;
        auVar172._8_4_ = auVar125._8_4_ * auVar117._8_4_;
        auVar172._12_4_ = auVar125._12_4_ * auVar117._12_4_;
        auVar172._16_4_ = fVar178 * auVar117._16_4_;
        auVar172._20_4_ = fVar160 * auVar117._20_4_;
        auVar172._24_4_ = fVar169 * auVar117._24_4_;
        auVar172._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar172,auVar116,auVar124);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar98,auVar104);
        auVar108 = vfmadd231ps_avx512vl(auVar104,auVar98,ZEXT1632(auVar95));
        auVar104 = vmaxps_avx(auVar101,auVar108);
        uVar149 = vcmpps_avx512vl(auVar104,auVar98,2);
        local_410 = local_410 & (byte)uVar149;
        in_ZMM20 = ZEXT3264(local_5c0);
        in_ZMM21 = ZEXT3264(local_5e0);
        auVar202 = ZEXT3264(local_560);
        auVar200 = ZEXT3264(local_6a0);
        auVar196 = ZEXT1664(local_700);
        if (local_410 == 0) {
          local_410 = 0;
          auVar185 = ZEXT3264(auVar103);
          auVar158 = ZEXT3264(auVar102);
        }
        else {
          auVar49._4_4_ = auVar105._4_4_ * auVar115._4_4_;
          auVar49._0_4_ = auVar105._0_4_ * auVar115._0_4_;
          auVar49._8_4_ = auVar105._8_4_ * auVar115._8_4_;
          auVar49._12_4_ = auVar105._12_4_ * auVar115._12_4_;
          auVar49._16_4_ = auVar105._16_4_ * auVar115._16_4_;
          auVar49._20_4_ = auVar105._20_4_ * auVar115._20_4_;
          auVar49._24_4_ = auVar105._24_4_ * auVar115._24_4_;
          auVar49._28_4_ = auVar104._28_4_;
          auVar8 = vfmsub231ps_fma(auVar49,auVar116,auVar118);
          auVar50._4_4_ = auVar118._4_4_ * auVar117._4_4_;
          auVar50._0_4_ = auVar118._0_4_ * auVar117._0_4_;
          auVar50._8_4_ = auVar118._8_4_ * auVar117._8_4_;
          auVar50._12_4_ = auVar118._12_4_ * auVar117._12_4_;
          auVar50._16_4_ = auVar118._16_4_ * auVar117._16_4_;
          auVar50._20_4_ = auVar118._20_4_ * auVar117._20_4_;
          auVar50._24_4_ = auVar118._24_4_ * auVar117._24_4_;
          auVar50._28_4_ = auVar118._28_4_;
          auVar94 = vfmsub231ps_fma(auVar50,auVar100,auVar105);
          auVar51._4_4_ = auVar116._4_4_ * auVar100._4_4_;
          auVar51._0_4_ = auVar116._0_4_ * auVar100._0_4_;
          auVar51._8_4_ = auVar116._8_4_ * auVar100._8_4_;
          auVar51._12_4_ = auVar116._12_4_ * auVar100._12_4_;
          auVar51._16_4_ = auVar116._16_4_ * auVar100._16_4_;
          auVar51._20_4_ = auVar116._20_4_ * auVar100._20_4_;
          auVar51._24_4_ = auVar116._24_4_ * auVar100._24_4_;
          auVar51._28_4_ = auVar116._28_4_;
          auVar9 = vfmsub231ps_fma(auVar51,auVar117,auVar115);
          auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar9));
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar8),auVar98);
          auVar115 = vrcp14ps_avx512vl(auVar104);
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = &DAT_3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar27._16_4_ = 0x3f800000;
          auVar27._20_4_ = 0x3f800000;
          auVar27._24_4_ = 0x3f800000;
          auVar27._28_4_ = 0x3f800000;
          auVar118 = vfnmadd213ps_avx512vl(auVar115,auVar104,auVar27);
          auVar95 = vfmadd132ps_fma(auVar118,auVar115,auVar115);
          auVar52._4_4_ = auVar9._4_4_ * auVar123._4_4_;
          auVar52._0_4_ = auVar9._0_4_ * auVar123._0_4_;
          auVar52._8_4_ = auVar9._8_4_ * auVar123._8_4_;
          auVar52._12_4_ = auVar9._12_4_ * auVar123._12_4_;
          auVar52._16_4_ = fVar170 * 0.0;
          auVar52._20_4_ = fVar147 * 0.0;
          auVar52._24_4_ = fVar177 * 0.0;
          auVar52._28_4_ = iVar1;
          auVar94 = vfmadd231ps_fma(auVar52,auVar107,ZEXT1632(auVar94));
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,ZEXT1632(auVar8));
          fVar170 = auVar95._0_4_;
          fVar147 = auVar95._4_4_;
          fVar177 = auVar95._8_4_;
          fVar178 = auVar95._12_4_;
          auVar115 = ZEXT1632(CONCAT412(auVar94._12_4_ * fVar178,
                                        CONCAT48(auVar94._8_4_ * fVar177,
                                                 CONCAT44(auVar94._4_4_ * fVar147,
                                                          auVar94._0_4_ * fVar170))));
          auVar158 = ZEXT3264(auVar115);
          auVar187._4_4_ = uVar190;
          auVar187._0_4_ = uVar190;
          auVar187._8_4_ = uVar190;
          auVar187._12_4_ = uVar190;
          auVar187._16_4_ = uVar190;
          auVar187._20_4_ = uVar190;
          auVar187._24_4_ = uVar190;
          auVar187._28_4_ = uVar190;
          uVar149 = vcmpps_avx512vl(auVar187,auVar115,2);
          uVar148 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar28._4_4_ = uVar148;
          auVar28._0_4_ = uVar148;
          auVar28._8_4_ = uVar148;
          auVar28._12_4_ = uVar148;
          auVar28._16_4_ = uVar148;
          auVar28._20_4_ = uVar148;
          auVar28._24_4_ = uVar148;
          auVar28._28_4_ = uVar148;
          uVar25 = vcmpps_avx512vl(auVar115,auVar28,2);
          local_410 = (byte)uVar149 & (byte)uVar25 & local_410;
          if (local_410 == 0) {
            local_410 = 0;
            auVar185 = ZEXT3264(auVar103);
            auVar158 = ZEXT3264(auVar102);
          }
          else {
            uVar149 = vcmpps_avx512vl(auVar104,auVar98,4);
            if ((local_410 & (byte)uVar149) == 0) {
              local_410 = 0;
              auVar185 = ZEXT3264(auVar103);
              auVar158 = ZEXT3264(auVar102);
            }
            else {
              local_410 = local_410 & (byte)uVar149;
              fVar160 = auVar101._0_4_ * fVar170;
              fVar169 = auVar101._4_4_ * fVar147;
              auVar53._4_4_ = fVar169;
              auVar53._0_4_ = fVar160;
              fVar91 = auVar101._8_4_ * fVar177;
              auVar53._8_4_ = fVar91;
              fVar92 = auVar101._12_4_ * fVar178;
              auVar53._12_4_ = fVar92;
              fVar159 = auVar101._16_4_ * 0.0;
              auVar53._16_4_ = fVar159;
              fVar139 = auVar101._20_4_ * 0.0;
              auVar53._20_4_ = fVar139;
              fVar140 = auVar101._24_4_ * 0.0;
              auVar53._24_4_ = fVar140;
              auVar53._28_4_ = auVar101._28_4_;
              fVar170 = auVar108._0_4_ * fVar170;
              fVar147 = auVar108._4_4_ * fVar147;
              auVar54._4_4_ = fVar147;
              auVar54._0_4_ = fVar170;
              fVar177 = auVar108._8_4_ * fVar177;
              auVar54._8_4_ = fVar177;
              fVar178 = auVar108._12_4_ * fVar178;
              auVar54._12_4_ = fVar178;
              fVar141 = auVar108._16_4_ * 0.0;
              auVar54._16_4_ = fVar141;
              fVar143 = auVar108._20_4_ * 0.0;
              auVar54._20_4_ = fVar143;
              fVar144 = auVar108._24_4_ * 0.0;
              auVar54._24_4_ = fVar144;
              auVar54._28_4_ = auVar108._28_4_;
              auVar181._8_4_ = 0x3f800000;
              auVar181._0_8_ = &DAT_3f8000003f800000;
              auVar181._12_4_ = 0x3f800000;
              auVar181._16_4_ = 0x3f800000;
              auVar181._20_4_ = 0x3f800000;
              auVar181._24_4_ = 0x3f800000;
              auVar181._28_4_ = 0x3f800000;
              auVar104 = vsubps_avx(auVar181,auVar53);
              bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar22 = SUB81(uVar83 >> 7,0);
              auVar185 = ZEXT3264(CONCAT428((uint)bVar22 * auVar101._28_4_ |
                                            (uint)!bVar22 * auVar104._28_4_,
                                            CONCAT424((uint)bVar20 * (int)fVar140 |
                                                      (uint)!bVar20 * auVar104._24_4_,
                                                      CONCAT420((uint)bVar19 * (int)fVar139 |
                                                                (uint)!bVar19 * auVar104._20_4_,
                                                                CONCAT416((uint)bVar18 *
                                                                          (int)fVar159 |
                                                                          (uint)!bVar18 *
                                                                          auVar104._16_4_,
                                                                          CONCAT412((uint)bVar17 *
                                                                                    (int)fVar92 |
                                                                                    (uint)!bVar17 *
                                                                                    auVar104._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar16 * (int)fVar91 |
                                                  (uint)!bVar16 * auVar104._8_4_,
                                                  CONCAT44((uint)bVar86 * (int)fVar169 |
                                                           (uint)!bVar86 * auVar104._4_4_,
                                                           (uint)(bVar85 & 1) * (int)fVar160 |
                                                           (uint)!(bool)(bVar85 & 1) *
                                                           auVar104._0_4_))))))));
              auVar104 = vsubps_avx(auVar181,auVar54);
              bVar86 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar22 = SUB81(uVar83 >> 7,0);
              local_340._4_4_ = (uint)bVar86 * (int)fVar147 | (uint)!bVar86 * auVar104._4_4_;
              local_340._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar170 | (uint)!(bool)(bVar85 & 1) * auVar104._0_4_;
              local_340._8_4_ = (uint)bVar16 * (int)fVar177 | (uint)!bVar16 * auVar104._8_4_;
              local_340._12_4_ = (uint)bVar17 * (int)fVar178 | (uint)!bVar17 * auVar104._12_4_;
              local_340._16_4_ = (uint)bVar18 * (int)fVar141 | (uint)!bVar18 * auVar104._16_4_;
              local_340._20_4_ = (uint)bVar19 * (int)fVar143 | (uint)!bVar19 * auVar104._20_4_;
              local_340._24_4_ = (uint)bVar20 * (int)fVar144 | (uint)!bVar20 * auVar104._24_4_;
              local_340._28_4_ = (uint)bVar22 * auVar108._28_4_ | (uint)!bVar22 * auVar104._28_4_;
            }
          }
        }
        auVar206 = ZEXT3264(local_620);
        auVar205 = ZEXT3264(local_600);
        if (local_410 != 0) {
          auVar104 = vsubps_avx(ZEXT1632(auVar203),auVar112);
          auVar103 = auVar185._0_32_;
          auVar95 = vfmadd213ps_fma(auVar104,auVar103,auVar112);
          uVar148 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar29._4_4_ = uVar148;
          auVar29._0_4_ = uVar148;
          auVar29._8_4_ = uVar148;
          auVar29._12_4_ = uVar148;
          auVar29._16_4_ = uVar148;
          auVar29._20_4_ = uVar148;
          auVar29._24_4_ = uVar148;
          auVar29._28_4_ = uVar148;
          auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                        CONCAT48(auVar95._8_4_ + auVar95._8_4_,
                                                                 CONCAT44(auVar95._4_4_ +
                                                                          auVar95._4_4_,
                                                                          auVar95._0_4_ +
                                                                          auVar95._0_4_)))),auVar29)
          ;
          auVar102 = auVar158._0_32_;
          uVar149 = vcmpps_avx512vl(auVar102,auVar104,6);
          local_410 = local_410 & (byte)uVar149;
          if (local_410 != 0) {
            auVar152._8_4_ = 0xbf800000;
            auVar152._0_8_ = 0xbf800000bf800000;
            auVar152._12_4_ = 0xbf800000;
            auVar152._16_4_ = 0xbf800000;
            auVar152._20_4_ = 0xbf800000;
            auVar152._24_4_ = 0xbf800000;
            auVar152._28_4_ = 0xbf800000;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar30._16_4_ = 0x40000000;
            auVar30._20_4_ = 0x40000000;
            auVar30._24_4_ = 0x40000000;
            auVar30._28_4_ = 0x40000000;
            local_4a0 = vfmadd132ps_avx512vl(local_340,auVar152,auVar30);
            local_340 = local_4a0;
            auVar104 = local_340;
            local_460 = 0;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar86 = true, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar170 = 1.0 / auVar193._0_4_;
                local_400[0] = fVar170 * (auVar185._0_4_ + 0.0);
                local_400[1] = fVar170 * (auVar185._4_4_ + 1.0);
                local_400[2] = fVar170 * (auVar185._8_4_ + 2.0);
                local_400[3] = fVar170 * (auVar185._12_4_ + 3.0);
                fStack_3f0 = fVar170 * (auVar185._16_4_ + 4.0);
                fStack_3ec = fVar170 * (auVar185._20_4_ + 5.0);
                fStack_3e8 = fVar170 * (auVar185._24_4_ + 6.0);
                fStack_3e4 = auVar185._28_4_ + 7.0;
                local_340._0_8_ = local_4a0._0_8_;
                local_340._8_8_ = local_4a0._8_8_;
                local_340._16_8_ = local_4a0._16_8_;
                local_340._24_8_ = local_4a0._24_8_;
                local_3e0 = local_340._0_8_;
                uStack_3d8 = local_340._8_8_;
                uStack_3d0 = local_340._16_8_;
                uStack_3c8 = local_340._24_8_;
                local_3c0 = auVar102;
                lVar90 = 0;
                uVar87 = (ulong)local_410;
                for (uVar83 = uVar87; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000)
                {
                  lVar90 = lVar90 + 1;
                }
                _local_3a0 = vpbroadcastd_avx512vl();
                local_540 = vpbroadcastd_avx512vl();
                local_6e0 = (undefined4)local_6c0;
                uStack_6dc = (undefined4)((ulong)local_6c0 >> 0x20);
                bVar86 = true;
                local_6f0 = local_660;
                uStack_6e8 = uStack_658;
                uStack_6d8 = uStack_6b8;
                uStack_6c8 = uStack_6a8;
                local_4c0 = auVar103;
                local_480 = auVar102;
                local_45c = iVar13;
                local_450 = auVar24;
                local_440 = local_6d0;
                uStack_438 = uStack_6a8;
                local_430 = local_6c0;
                uStack_428 = uStack_6b8;
                local_420 = local_660;
                uStack_418 = uStack_658;
                local_340 = auVar104;
                do {
                  auVar203 = auVar204._0_16_;
                  local_500 = (float)uVar87;
                  fStack_4fc = (float)(uVar87 >> 0x20);
                  uVar148 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar170 = local_400[lVar90];
                  auVar155._4_4_ = fVar170;
                  auVar155._0_4_ = fVar170;
                  auVar155._8_4_ = fVar170;
                  auVar155._12_4_ = fVar170;
                  local_260._16_4_ = fVar170;
                  local_260._0_16_ = auVar155;
                  local_260._20_4_ = fVar170;
                  local_260._24_4_ = fVar170;
                  local_260._28_4_ = fVar170;
                  local_380 = (uint)lVar90;
                  uStack_37c = (uint)((ulong)lVar90 >> 0x20);
                  local_240 = *(undefined4 *)((long)&local_3e0 + lVar90 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + lVar90 * 4);
                  local_730.context = context->user;
                  fVar147 = 1.0 - fVar170;
                  auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar170 * (fVar147 + fVar147))),
                                            ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                  auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar155,
                                            ZEXT416(0xc0a00000));
                  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * 3.0)),
                                            ZEXT416((uint)(fVar170 + fVar170)),auVar95);
                  auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar155,
                                            ZEXT416(0x40000000));
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * -3.0)),
                                            ZEXT416((uint)(fVar147 + fVar147)),auVar95);
                  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),auVar155,
                                           ZEXT416((uint)(fVar147 * -2.0)));
                  fVar170 = auVar9._0_4_ * 0.5;
                  fVar147 = auVar94._0_4_ * 0.5;
                  fVar177 = auVar95._0_4_ * 0.5;
                  fVar178 = auVar8._0_4_ * 0.5;
                  auVar162._0_4_ = fVar178 * (float)local_6f0;
                  auVar162._4_4_ = fVar178 * local_6f0._4_4_;
                  auVar162._8_4_ = fVar178 * (float)uStack_6e8;
                  auVar162._12_4_ = fVar178 * uStack_6e8._4_4_;
                  auVar179._4_4_ = fVar177;
                  auVar179._0_4_ = fVar177;
                  auVar179._8_4_ = fVar177;
                  auVar179._12_4_ = fVar177;
                  auVar74._4_4_ = uStack_6dc;
                  auVar74._0_4_ = local_6e0;
                  auVar74._8_8_ = uStack_6d8;
                  auVar95 = vfmadd132ps_fma(auVar179,auVar162,auVar74);
                  auVar163._4_4_ = fVar147;
                  auVar163._0_4_ = fVar147;
                  auVar163._8_4_ = fVar147;
                  auVar163._12_4_ = fVar147;
                  auVar75._8_8_ = uStack_6c8;
                  auVar75._0_8_ = local_6d0;
                  auVar95 = vfmadd132ps_fma(auVar163,auVar95,auVar75);
                  auVar150._4_4_ = fVar170;
                  auVar150._0_4_ = fVar170;
                  auVar150._8_4_ = fVar170;
                  auVar150._12_4_ = fVar170;
                  auVar95 = vfmadd213ps_fma(auVar150,auVar24,auVar95);
                  local_2c0 = auVar95._0_4_;
                  auVar173._8_4_ = 1;
                  auVar173._0_8_ = 0x100000001;
                  auVar173._12_4_ = 1;
                  auVar173._16_4_ = 1;
                  auVar173._20_4_ = 1;
                  auVar173._24_4_ = 1;
                  auVar173._28_4_ = 1;
                  local_2a0 = vpermps_avx2(auVar173,ZEXT1632(auVar95));
                  auVar182._8_4_ = 2;
                  auVar182._0_8_ = 0x200000002;
                  auVar182._12_4_ = 2;
                  auVar182._16_4_ = 2;
                  auVar182._20_4_ = 2;
                  auVar182._24_4_ = 2;
                  auVar182._28_4_ = 2;
                  local_280 = vpermps_avx2(auVar182,ZEXT1632(auVar95));
                  uStack_2bc = local_2c0;
                  uStack_2b8 = local_2c0;
                  uStack_2b4 = local_2c0;
                  uStack_2b0 = local_2c0;
                  uStack_2ac = local_2c0;
                  uStack_2a8 = local_2c0;
                  uStack_2a4 = local_2c0;
                  uStack_23c = local_240;
                  uStack_238 = local_240;
                  uStack_234 = local_240;
                  uStack_230 = local_240;
                  uStack_22c = local_240;
                  uStack_228 = local_240;
                  uStack_224 = local_240;
                  local_220 = local_540._0_8_;
                  uStack_218 = local_540._8_8_;
                  uStack_210 = local_540._16_8_;
                  uStack_208 = local_540._24_8_;
                  local_200 = _local_3a0;
                  vpcmpeqd_avx2(_local_3a0,_local_3a0);
                  local_1e0 = (local_730.context)->instID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = (local_730.context)->instPrimID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_680 = local_300._0_8_;
                  uStack_678 = local_300._8_8_;
                  uStack_670 = local_300._16_8_;
                  uStack_668 = local_300._24_8_;
                  local_730.valid = (int *)&local_680;
                  local_730.geometryUserPtr = pGVar14->userPtr;
                  local_730.hit = (RTCHitN *)&local_2c0;
                  local_730.N = 8;
                  local_520._0_4_ = uVar148;
                  local_730.ray = (RTCRayN *)ray;
                  if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar14->occlusionFilterN)(&local_730);
                    auVar196 = ZEXT1664(local_700);
                    auVar206 = ZEXT3264(local_620);
                    auVar205 = ZEXT3264(local_600);
                    auVar200 = ZEXT3264(local_6a0);
                    auVar201 = ZEXT3264(local_580);
                    auVar202 = ZEXT3264(local_560);
                    in_ZMM21 = ZEXT3264(local_5e0);
                    in_ZMM20 = ZEXT3264(local_5c0);
                    auVar95 = vxorps_avx512vl(auVar203,auVar203);
                    auVar204 = ZEXT1664(auVar95);
                    uVar148 = local_520._0_4_;
                    uVar190 = local_640._0_4_;
                  }
                  auVar95 = auVar204._0_16_;
                  auVar76._8_8_ = uStack_678;
                  auVar76._0_8_ = local_680;
                  auVar76._16_8_ = uStack_670;
                  auVar76._24_8_ = uStack_668;
                  if (auVar76 == (undefined1  [32])0x0) {
                    uVar87 = CONCAT44(fStack_4fc,local_500);
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_730);
                      auVar196 = ZEXT1664(local_700);
                      auVar206 = ZEXT3264(local_620);
                      auVar205 = ZEXT3264(local_600);
                      auVar200 = ZEXT3264(local_6a0);
                      auVar201 = ZEXT3264(local_580);
                      auVar202 = ZEXT3264(local_560);
                      in_ZMM21 = ZEXT3264(local_5e0);
                      in_ZMM20 = ZEXT3264(local_5c0);
                      auVar95 = vxorps_avx512vl(auVar95,auVar95);
                      auVar204 = ZEXT1664(auVar95);
                      uVar190 = local_640._0_4_;
                      uVar148 = local_520._0_4_;
                    }
                    auVar77._8_8_ = uStack_678;
                    auVar77._0_8_ = local_680;
                    auVar77._16_8_ = uStack_670;
                    auVar77._24_8_ = uStack_668;
                    uVar83 = vptestmd_avx512vl(auVar77,auVar77);
                    auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar16 = (bool)((byte)uVar83 & 1);
                    bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar83 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar83 >> 4) & 1);
                    bVar22 = (bool)((byte)(uVar83 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar83 >> 6) & 1);
                    bVar23 = SUB81(uVar83 >> 7,0);
                    *(uint *)(local_730.ray + 0x100) =
                         (uint)bVar16 * auVar104._0_4_ |
                         (uint)!bVar16 * *(int *)(local_730.ray + 0x100);
                    *(uint *)(local_730.ray + 0x104) =
                         (uint)bVar17 * auVar104._4_4_ |
                         (uint)!bVar17 * *(int *)(local_730.ray + 0x104);
                    *(uint *)(local_730.ray + 0x108) =
                         (uint)bVar18 * auVar104._8_4_ |
                         (uint)!bVar18 * *(int *)(local_730.ray + 0x108);
                    *(uint *)(local_730.ray + 0x10c) =
                         (uint)bVar19 * auVar104._12_4_ |
                         (uint)!bVar19 * *(int *)(local_730.ray + 0x10c);
                    *(uint *)(local_730.ray + 0x110) =
                         (uint)bVar20 * auVar104._16_4_ |
                         (uint)!bVar20 * *(int *)(local_730.ray + 0x110);
                    *(uint *)(local_730.ray + 0x114) =
                         (uint)bVar22 * auVar104._20_4_ |
                         (uint)!bVar22 * *(int *)(local_730.ray + 0x114);
                    *(uint *)(local_730.ray + 0x118) =
                         (uint)bVar21 * auVar104._24_4_ |
                         (uint)!bVar21 * *(int *)(local_730.ray + 0x118);
                    *(uint *)(local_730.ray + 0x11c) =
                         (uint)bVar23 * auVar104._28_4_ |
                         (uint)!bVar23 * *(int *)(local_730.ray + 0x11c);
                    uVar87 = CONCAT44(fStack_4fc,local_500);
                    local_500 = auVar196._0_4_;
                    if (auVar77 != (undefined1  [32])0x0) break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar148;
                  lVar90 = 0;
                  uVar87 = uVar87 ^ 1L << ((ulong)local_380 & 0x3f);
                  for (uVar83 = uVar87; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000
                      ) {
                    lVar90 = lVar90 + 1;
                  }
                  bVar86 = uVar87 != 0;
                  local_500 = auVar196._0_4_;
                } while (bVar86);
                auVar185 = ZEXT3264(auVar103);
                auVar158 = ZEXT3264(auVar102);
              }
              goto LAB_01dc6c2a;
            }
          }
        }
        bVar86 = false;
      }
LAB_01dc6c2a:
      if (8 < iVar13) {
        local_640 = vpbroadcastd_avx512vl();
        local_380 = uVar190;
        uStack_37c = uVar190;
        uStack_378 = uVar190;
        uStack_374 = uVar190;
        uStack_370 = uVar190;
        uStack_36c = uVar190;
        uStack_368 = uVar190;
        uStack_364 = uVar190;
        local_3a0._4_4_ = 1.0 / (float)local_4e0._0_4_;
        local_3a0._0_4_ = local_3a0._4_4_;
        fStack_398 = (float)local_3a0._4_4_;
        fStack_394 = (float)local_3a0._4_4_;
        fStack_390 = (float)local_3a0._4_4_;
        fStack_38c = (float)local_3a0._4_4_;
        fStack_388 = (float)local_3a0._4_4_;
        fStack_384 = (float)local_3a0._4_4_;
        local_4e0 = vpbroadcastd_avx512vl();
        local_520 = vpbroadcastd_avx512vl();
        lVar90 = 8;
        auVar102 = auVar185._0_32_;
        auVar104 = auVar158._0_32_;
        fStack_4fc = local_500;
        fStack_4f8 = local_500;
        fStack_4f4 = local_500;
        fStack_4f0 = local_500;
        fStack_4ec = local_500;
        fStack_4e8 = local_500;
        fStack_4e4 = local_500;
        do {
          auVar103 = vpbroadcastd_avx512vl();
          auVar116 = vpor_avx2(auVar103,_DAT_0205a920);
          uVar25 = vpcmpd_avx512vl(auVar116,local_640,1);
          auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 * 4 + lVar26);
          auVar115 = *(undefined1 (*) [32])(lVar26 + 0x22307f0 + lVar90 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar26 + 0x2230c74 + lVar90 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar26 + 0x22310f8 + lVar90 * 4);
          local_600 = auVar205._0_32_;
          auVar105 = vmulps_avx512vl(local_600,auVar117);
          local_620 = auVar206._0_32_;
          auVar106 = vmulps_avx512vl(local_620,auVar117);
          auVar55._4_4_ = auVar117._4_4_ * (float)local_140._4_4_;
          auVar55._0_4_ = auVar117._0_4_ * (float)local_140._0_4_;
          auVar55._8_4_ = auVar117._8_4_ * fStack_138;
          auVar55._12_4_ = auVar117._12_4_ * fStack_134;
          auVar55._16_4_ = auVar117._16_4_ * fStack_130;
          auVar55._20_4_ = auVar117._20_4_ * fStack_12c;
          auVar55._24_4_ = auVar117._24_4_ * fStack_128;
          auVar55._28_4_ = auVar116._28_4_;
          auVar116 = vfmadd231ps_avx512vl(auVar105,auVar118,local_e0);
          auVar105 = vfmadd231ps_avx512vl(auVar106,auVar118,local_100);
          auVar106 = vfmadd231ps_avx512vl(auVar55,auVar118,local_120);
          auVar113 = auVar200._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar113);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_2e0);
          auVar95 = vfmadd231ps_fma(auVar106,auVar115,local_c0);
          auVar194 = auVar202._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar116,auVar103,auVar194);
          auVar114 = auVar201._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar114);
          auVar116 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 * 4 + lVar26);
          auVar105 = *(undefined1 (*) [32])(lVar26 + 0x2232c10 + lVar90 * 4);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar103,local_a0);
          auVar106 = *(undefined1 (*) [32])(lVar26 + 0x2233094 + lVar90 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x2233518 + lVar90 * 4);
          auVar100 = vmulps_avx512vl(local_600,auVar107);
          auVar101 = vmulps_avx512vl(local_620,auVar107);
          auVar56._4_4_ = auVar107._4_4_ * (float)local_140._4_4_;
          auVar56._0_4_ = auVar107._0_4_ * (float)local_140._0_4_;
          auVar56._8_4_ = auVar107._8_4_ * fStack_138;
          auVar56._12_4_ = auVar107._12_4_ * fStack_134;
          auVar56._16_4_ = auVar107._16_4_ * fStack_130;
          auVar56._20_4_ = auVar107._20_4_ * fStack_12c;
          auVar56._24_4_ = auVar107._24_4_ * fStack_128;
          auVar56._28_4_ = uStack_124;
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_e0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_100);
          auVar99 = vfmadd231ps_avx512vl(auVar56,auVar106,local_120);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,auVar113);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_2e0);
          auVar94 = vfmadd231ps_fma(auVar99,auVar105,local_c0);
          auVar99 = vfmadd231ps_avx512vl(auVar100,auVar116,auVar194);
          auVar109 = vfmadd231ps_avx512vl(auVar101,auVar116,auVar114);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar116,local_a0);
          auVar110 = vmaxps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar94));
          auVar100 = vsubps_avx(auVar99,auVar108);
          auVar101 = vsubps_avx(auVar109,auVar98);
          auVar111 = vmulps_avx512vl(auVar98,auVar100);
          auVar112 = vmulps_avx512vl(auVar108,auVar101);
          auVar111 = vsubps_avx512vl(auVar111,auVar112);
          auVar112 = vmulps_avx512vl(auVar101,auVar101);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar100,auVar100);
          auVar110 = vmulps_avx512vl(auVar110,auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar112);
          auVar111 = vmulps_avx512vl(auVar111,auVar111);
          uVar149 = vcmpps_avx512vl(auVar111,auVar110,2);
          local_410 = (byte)uVar25 & (byte)uVar149;
          if (local_410 == 0) {
            auVar196 = ZEXT3264(auVar114);
            auVar200 = ZEXT3264(auVar113);
          }
          else {
            auVar107 = vmulps_avx512vl(local_5a0,auVar107);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_1a0,auVar107);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_180,auVar106);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_160,auVar105);
            auVar117 = vmulps_avx512vl(local_5a0,auVar117);
            auVar118 = vfmadd213ps_avx512vl(auVar118,local_1a0,auVar117);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_180,auVar118);
            auVar105 = vfmadd213ps_avx512vl(auVar103,local_160,auVar115);
            auVar103 = *(undefined1 (*) [32])(lVar26 + 0x223157c + lVar90 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar26 + 0x2231a00 + lVar90 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar26 + 0x2231e84 + lVar90 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar26 + 0x2232308 + lVar90 * 4);
            auVar106 = vmulps_avx512vl(local_600,auVar117);
            auVar107 = vmulps_avx512vl(local_620,auVar117);
            auVar117 = vmulps_avx512vl(local_5a0,auVar117);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,local_e0);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar118,local_100);
            auVar118 = vfmadd231ps_avx512vl(auVar117,local_1a0,auVar118);
            auVar117 = vfmadd231ps_avx512vl(auVar106,auVar115,auVar113);
            auVar106 = vfmadd231ps_avx512vl(auVar107,auVar115,local_2e0);
            auVar115 = vfmadd231ps_avx512vl(auVar118,local_180,auVar115);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar103,auVar194);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar114);
            auVar107 = vfmadd231ps_avx512vl(auVar115,local_160,auVar103);
            auVar103 = *(undefined1 (*) [32])(lVar26 + 0x223399c + lVar90 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar26 + 0x22342a4 + lVar90 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar26 + 0x2234728 + lVar90 * 4);
            auVar110 = vmulps_avx512vl(local_600,auVar118);
            auVar111 = vmulps_avx512vl(local_620,auVar118);
            auVar118 = vmulps_avx512vl(local_5a0,auVar118);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_e0);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,local_100);
            auVar118 = vfmadd231ps_avx512vl(auVar118,local_1a0,auVar115);
            auVar115 = *(undefined1 (*) [32])(lVar26 + 0x2233e20 + lVar90 * 4);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,auVar113);
            auVar8 = vfmadd231ps_fma(auVar111,auVar115,local_2e0);
            auVar115 = vfmadd231ps_avx512vl(auVar118,local_180,auVar115);
            auVar118 = vfmadd231ps_avx512vl(auVar110,auVar103,auVar194);
            auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar103,auVar114);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_160,auVar103);
            auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar117,auVar111);
            vandps_avx512vl(auVar106,auVar111);
            auVar103 = vmaxps_avx(auVar111,auVar111);
            vandps_avx512vl(auVar107,auVar111);
            auVar103 = vmaxps_avx(auVar103,auVar111);
            auVar80._4_4_ = fStack_4fc;
            auVar80._0_4_ = local_500;
            auVar80._8_4_ = fStack_4f8;
            auVar80._12_4_ = fStack_4f4;
            auVar80._16_4_ = fStack_4f0;
            auVar80._20_4_ = fStack_4ec;
            auVar80._24_4_ = fStack_4e8;
            auVar80._28_4_ = fStack_4e4;
            uVar83 = vcmpps_avx512vl(auVar103,auVar80,1);
            bVar16 = (bool)((byte)uVar83 & 1);
            auVar129._0_4_ = (float)((uint)bVar16 * auVar100._0_4_ | (uint)!bVar16 * auVar117._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar117._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar117._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar117._12_4_);
            bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar16 * auVar100._16_4_ | (uint)!bVar16 * auVar117._16_4_);
            bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar16 * auVar100._20_4_ | (uint)!bVar16 * auVar117._20_4_);
            bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar16 * auVar100._24_4_ | (uint)!bVar16 * auVar117._24_4_);
            bVar16 = SUB81(uVar83 >> 7,0);
            auVar129._28_4_ = (uint)bVar16 * auVar100._28_4_ | (uint)!bVar16 * auVar117._28_4_;
            bVar16 = (bool)((byte)uVar83 & 1);
            auVar130._0_4_ = (float)((uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar106._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar106._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar106._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar106._12_4_);
            bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar106._16_4_);
            bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar106._20_4_);
            bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar106._24_4_);
            bVar16 = SUB81(uVar83 >> 7,0);
            auVar130._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar106._28_4_;
            vandps_avx512vl(auVar118,auVar111);
            vandps_avx512vl(auVar110,auVar111);
            auVar103 = vmaxps_avx(auVar130,auVar130);
            vandps_avx512vl(auVar115,auVar111);
            auVar103 = vmaxps_avx(auVar103,auVar130);
            uVar83 = vcmpps_avx512vl(auVar103,auVar80,1);
            bVar16 = (bool)((byte)uVar83 & 1);
            auVar131._0_4_ = (uint)bVar16 * auVar100._0_4_ | (uint)!bVar16 * auVar118._0_4_;
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar118._4_4_;
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar118._8_4_;
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar118._12_4_;
            bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar131._16_4_ = (uint)bVar16 * auVar100._16_4_ | (uint)!bVar16 * auVar118._16_4_;
            bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar131._20_4_ = (uint)bVar16 * auVar100._20_4_ | (uint)!bVar16 * auVar118._20_4_;
            bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar131._24_4_ = (uint)bVar16 * auVar100._24_4_ | (uint)!bVar16 * auVar118._24_4_;
            bVar16 = SUB81(uVar83 >> 7,0);
            auVar131._28_4_ = (uint)bVar16 * auVar100._28_4_ | (uint)!bVar16 * auVar118._28_4_;
            bVar16 = (bool)((byte)uVar83 & 1);
            auVar132._0_4_ = (float)((uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar110._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar110._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar110._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar110._12_4_);
            bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar132._16_4_ =
                 (float)((uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar110._16_4_);
            bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar132._20_4_ =
                 (float)((uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar110._20_4_);
            bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar132._24_4_ =
                 (float)((uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar110._24_4_);
            bVar16 = SUB81(uVar83 >> 7,0);
            auVar132._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar110._28_4_;
            auVar189._8_4_ = 0x80000000;
            auVar189._0_8_ = 0x8000000080000000;
            auVar189._12_4_ = 0x80000000;
            auVar189._16_4_ = 0x80000000;
            auVar189._20_4_ = 0x80000000;
            auVar189._24_4_ = 0x80000000;
            auVar189._28_4_ = 0x80000000;
            auVar103 = vxorps_avx512vl(auVar131,auVar189);
            auVar110 = auVar204._0_32_;
            auVar115 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar110);
            auVar8 = vfmadd231ps_fma(auVar115,auVar130,auVar130);
            auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar8));
            auVar199._8_4_ = 0xbf000000;
            auVar199._0_8_ = 0xbf000000bf000000;
            auVar199._12_4_ = 0xbf000000;
            auVar199._16_4_ = 0xbf000000;
            auVar199._20_4_ = 0xbf000000;
            auVar199._24_4_ = 0xbf000000;
            auVar199._28_4_ = 0xbf000000;
            fVar170 = auVar115._0_4_;
            fVar147 = auVar115._4_4_;
            fVar177 = auVar115._8_4_;
            fVar178 = auVar115._12_4_;
            fVar160 = auVar115._16_4_;
            fVar169 = auVar115._20_4_;
            fVar91 = auVar115._24_4_;
            auVar57._4_4_ = fVar147 * fVar147 * fVar147 * auVar8._4_4_ * -0.5;
            auVar57._0_4_ = fVar170 * fVar170 * fVar170 * auVar8._0_4_ * -0.5;
            auVar57._8_4_ = fVar177 * fVar177 * fVar177 * auVar8._8_4_ * -0.5;
            auVar57._12_4_ = fVar178 * fVar178 * fVar178 * auVar8._12_4_ * -0.5;
            auVar57._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
            auVar57._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar57._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
            auVar57._28_4_ = auVar130._28_4_;
            auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar115 = vfmadd231ps_avx512vl(auVar57,auVar118,auVar115);
            auVar58._4_4_ = auVar130._4_4_ * auVar115._4_4_;
            auVar58._0_4_ = auVar130._0_4_ * auVar115._0_4_;
            auVar58._8_4_ = auVar130._8_4_ * auVar115._8_4_;
            auVar58._12_4_ = auVar130._12_4_ * auVar115._12_4_;
            auVar58._16_4_ = auVar130._16_4_ * auVar115._16_4_;
            auVar58._20_4_ = auVar130._20_4_ * auVar115._20_4_;
            auVar58._24_4_ = auVar130._24_4_ * auVar115._24_4_;
            auVar58._28_4_ = 0;
            auVar59._4_4_ = auVar115._4_4_ * -auVar129._4_4_;
            auVar59._0_4_ = auVar115._0_4_ * -auVar129._0_4_;
            auVar59._8_4_ = auVar115._8_4_ * -auVar129._8_4_;
            auVar59._12_4_ = auVar115._12_4_ * -auVar129._12_4_;
            auVar59._16_4_ = auVar115._16_4_ * -auVar129._16_4_;
            auVar59._20_4_ = auVar115._20_4_ * -auVar129._20_4_;
            auVar59._24_4_ = auVar115._24_4_ * -auVar129._24_4_;
            auVar59._28_4_ = auVar130._28_4_;
            auVar117 = vmulps_avx512vl(auVar115,auVar110);
            auVar115 = vfmadd213ps_avx512vl(auVar131,auVar131,auVar110);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar132,auVar132);
            auVar106 = vrsqrt14ps_avx512vl(auVar115);
            auVar115 = vmulps_avx512vl(auVar115,auVar199);
            fVar170 = auVar106._0_4_;
            fVar147 = auVar106._4_4_;
            fVar177 = auVar106._8_4_;
            fVar178 = auVar106._12_4_;
            fVar160 = auVar106._16_4_;
            fVar169 = auVar106._20_4_;
            fVar91 = auVar106._24_4_;
            auVar60._4_4_ = fVar147 * fVar147 * fVar147 * auVar115._4_4_;
            auVar60._0_4_ = fVar170 * fVar170 * fVar170 * auVar115._0_4_;
            auVar60._8_4_ = fVar177 * fVar177 * fVar177 * auVar115._8_4_;
            auVar60._12_4_ = fVar178 * fVar178 * fVar178 * auVar115._12_4_;
            auVar60._16_4_ = fVar160 * fVar160 * fVar160 * auVar115._16_4_;
            auVar60._20_4_ = fVar169 * fVar169 * fVar169 * auVar115._20_4_;
            auVar60._24_4_ = fVar91 * fVar91 * fVar91 * auVar115._24_4_;
            auVar60._28_4_ = auVar115._28_4_;
            auVar115 = vfmadd231ps_avx512vl(auVar60,auVar118,auVar106);
            auVar61._4_4_ = auVar132._4_4_ * auVar115._4_4_;
            auVar61._0_4_ = auVar132._0_4_ * auVar115._0_4_;
            auVar61._8_4_ = auVar132._8_4_ * auVar115._8_4_;
            auVar61._12_4_ = auVar132._12_4_ * auVar115._12_4_;
            auVar61._16_4_ = auVar132._16_4_ * auVar115._16_4_;
            auVar61._20_4_ = auVar132._20_4_ * auVar115._20_4_;
            auVar61._24_4_ = auVar132._24_4_ * auVar115._24_4_;
            auVar61._28_4_ = auVar106._28_4_;
            auVar62._4_4_ = auVar115._4_4_ * auVar103._4_4_;
            auVar62._0_4_ = auVar115._0_4_ * auVar103._0_4_;
            auVar62._8_4_ = auVar115._8_4_ * auVar103._8_4_;
            auVar62._12_4_ = auVar115._12_4_ * auVar103._12_4_;
            auVar62._16_4_ = auVar115._16_4_ * auVar103._16_4_;
            auVar62._20_4_ = auVar115._20_4_ * auVar103._20_4_;
            auVar62._24_4_ = auVar115._24_4_ * auVar103._24_4_;
            auVar62._28_4_ = auVar103._28_4_;
            auVar103 = vmulps_avx512vl(auVar115,auVar110);
            auVar8 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar95),auVar108);
            auVar115 = ZEXT1632(auVar95);
            auVar9 = vfmadd213ps_fma(auVar59,auVar115,auVar98);
            auVar118 = vfmadd213ps_avx512vl(auVar117,auVar115,auVar105);
            auVar106 = vfmadd213ps_avx512vl(auVar61,ZEXT1632(auVar94),auVar99);
            auVar157 = vfnmadd213ps_fma(auVar58,auVar115,auVar108);
            auVar107 = ZEXT1632(auVar94);
            auVar203 = vfmadd213ps_fma(auVar62,auVar107,auVar109);
            auVar96 = vfnmadd213ps_fma(auVar59,auVar115,auVar98);
            auVar93 = vfmadd213ps_fma(auVar103,auVar107,auVar116);
            auVar98 = ZEXT1632(auVar95);
            auVar97 = vfnmadd231ps_fma(auVar105,auVar98,auVar117);
            auVar161 = vfnmadd213ps_fma(auVar61,auVar107,auVar99);
            auVar186 = vfnmadd213ps_fma(auVar62,auVar107,auVar109);
            auVar188 = vfnmadd231ps_fma(auVar116,ZEXT1632(auVar94),auVar103);
            auVar116 = vsubps_avx512vl(auVar106,ZEXT1632(auVar157));
            auVar103 = vsubps_avx(ZEXT1632(auVar203),ZEXT1632(auVar96));
            auVar115 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar97));
            auVar63._4_4_ = auVar103._4_4_ * auVar97._4_4_;
            auVar63._0_4_ = auVar103._0_4_ * auVar97._0_4_;
            auVar63._8_4_ = auVar103._8_4_ * auVar97._8_4_;
            auVar63._12_4_ = auVar103._12_4_ * auVar97._12_4_;
            auVar63._16_4_ = auVar103._16_4_ * 0.0;
            auVar63._20_4_ = auVar103._20_4_ * 0.0;
            auVar63._24_4_ = auVar103._24_4_ * 0.0;
            auVar63._28_4_ = auVar117._28_4_;
            auVar95 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar96),auVar115);
            auVar64._4_4_ = auVar115._4_4_ * auVar157._4_4_;
            auVar64._0_4_ = auVar115._0_4_ * auVar157._0_4_;
            auVar64._8_4_ = auVar115._8_4_ * auVar157._8_4_;
            auVar64._12_4_ = auVar115._12_4_ * auVar157._12_4_;
            auVar64._16_4_ = auVar115._16_4_ * 0.0;
            auVar64._20_4_ = auVar115._20_4_ * 0.0;
            auVar64._24_4_ = auVar115._24_4_ * 0.0;
            auVar64._28_4_ = auVar115._28_4_;
            auVar10 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar97),auVar116);
            auVar65._4_4_ = auVar96._4_4_ * auVar116._4_4_;
            auVar65._0_4_ = auVar96._0_4_ * auVar116._0_4_;
            auVar65._8_4_ = auVar96._8_4_ * auVar116._8_4_;
            auVar65._12_4_ = auVar96._12_4_ * auVar116._12_4_;
            auVar65._16_4_ = auVar116._16_4_ * 0.0;
            auVar65._20_4_ = auVar116._20_4_ * 0.0;
            auVar65._24_4_ = auVar116._24_4_ * 0.0;
            auVar65._28_4_ = auVar116._28_4_;
            auVar11 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar157),auVar103);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar110,ZEXT1632(auVar10));
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar110,ZEXT1632(auVar95));
            uVar83 = vcmpps_avx512vl(auVar103,auVar110,2);
            bVar85 = (byte)uVar83;
            fVar139 = (float)((uint)(bVar85 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * auVar161._0_4_);
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar141 = (float)((uint)bVar16 * auVar8._4_4_ | (uint)!bVar16 * auVar161._4_4_);
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar144 = (float)((uint)bVar16 * auVar8._8_4_ | (uint)!bVar16 * auVar161._8_4_);
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar145 = (float)((uint)bVar16 * auVar8._12_4_ | (uint)!bVar16 * auVar161._12_4_);
            auVar107 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar144,CONCAT44(fVar141,fVar139))));
            fVar140 = (float)((uint)(bVar85 & 1) * auVar9._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * auVar186._0_4_);
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar143 = (float)((uint)bVar16 * auVar9._4_4_ | (uint)!bVar16 * auVar186._4_4_);
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar142 = (float)((uint)bVar16 * auVar9._8_4_ | (uint)!bVar16 * auVar186._8_4_);
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar146 = (float)((uint)bVar16 * auVar9._12_4_ | (uint)!bVar16 * auVar186._12_4_);
            auVar100 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar142,CONCAT44(fVar143,fVar140))));
            auVar133._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar118._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar188._0_4_);
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar16 * auVar118._4_4_ | (uint)!bVar16 * auVar188._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar16 * auVar118._8_4_ | (uint)!bVar16 * auVar188._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar16 * auVar118._12_4_ | (uint)!bVar16 * auVar188._12_4_);
            fVar177 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar118._16_4_);
            auVar133._16_4_ = fVar177;
            fVar170 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar118._20_4_);
            auVar133._20_4_ = fVar170;
            fVar147 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar118._24_4_);
            auVar133._24_4_ = fVar147;
            iVar1 = (uint)(byte)(uVar83 >> 7) * auVar118._28_4_;
            auVar133._28_4_ = iVar1;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar157),auVar106);
            auVar134._0_4_ =
                 (uint)(bVar85 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar95._0_4_;
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * auVar95._4_4_;
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * auVar95._8_4_;
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * auVar95._12_4_;
            auVar134._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar103._16_4_;
            auVar134._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar103._20_4_;
            auVar134._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar103._24_4_;
            auVar134._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar103._28_4_;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar203));
            auVar135._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar8._0_4_);
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * auVar8._4_4_);
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * auVar8._8_4_);
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * auVar8._12_4_);
            fVar169 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar103._16_4_);
            auVar135._16_4_ = fVar169;
            fVar160 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar103._20_4_);
            auVar135._20_4_ = fVar160;
            fVar178 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar103._24_4_);
            auVar135._24_4_ = fVar178;
            auVar135._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar103._28_4_;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar93));
            auVar136._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar9._0_4_);
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * auVar9._4_4_);
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * auVar9._8_4_);
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * auVar9._12_4_);
            fVar91 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar103._16_4_);
            auVar136._16_4_ = fVar91;
            fVar92 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar103._20_4_);
            auVar136._20_4_ = fVar92;
            fVar159 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar103._24_4_);
            auVar136._24_4_ = fVar159;
            iVar2 = (uint)(byte)(uVar83 >> 7) * auVar103._28_4_;
            auVar136._28_4_ = iVar2;
            auVar137._0_4_ =
                 (uint)(bVar85 & 1) * (int)auVar157._0_4_ |
                 (uint)!(bool)(bVar85 & 1) * auVar106._0_4_;
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar16 * (int)auVar157._4_4_ | (uint)!bVar16 * auVar106._4_4_;
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar16 * (int)auVar157._8_4_ | (uint)!bVar16 * auVar106._8_4_;
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar16 * (int)auVar157._12_4_ | (uint)!bVar16 * auVar106._12_4_;
            auVar137._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar106._16_4_;
            auVar137._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar106._20_4_;
            auVar137._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar106._24_4_;
            auVar137._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar106._28_4_;
            bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar83 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar106 = vsubps_avx512vl(auVar137,auVar107);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar96._12_4_ |
                                                     (uint)!bVar20 * auVar203._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar96._8_4_ |
                                                              (uint)!bVar18 * auVar203._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar96._4_4_ |
                                                                       (uint)!bVar16 *
                                                                       auVar203._4_4_,
                                                                       (uint)(bVar85 & 1) *
                                                                       (int)auVar96._0_4_ |
                                                                       (uint)!(bool)(bVar85 & 1) *
                                                                       auVar203._0_4_)))),auVar100);
            auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar97._12_4_ |
                                                     (uint)!bVar22 * auVar93._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar97._8_4_ |
                                                              (uint)!bVar19 * auVar93._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar97._4_4_ |
                                                                       (uint)!bVar17 * auVar93._4_4_
                                                                       ,(uint)(bVar85 & 1) *
                                                                        (int)auVar97._0_4_ |
                                                                        (uint)!(bool)(bVar85 & 1) *
                                                                        auVar93._0_4_)))),auVar133);
            auVar117 = vsubps_avx(auVar107,auVar134);
            auVar116 = vsubps_avx(auVar100,auVar135);
            auVar105 = vsubps_avx(auVar133,auVar136);
            auVar66._4_4_ = auVar118._4_4_ * fVar141;
            auVar66._0_4_ = auVar118._0_4_ * fVar139;
            auVar66._8_4_ = auVar118._8_4_ * fVar144;
            auVar66._12_4_ = auVar118._12_4_ * fVar145;
            auVar66._16_4_ = auVar118._16_4_ * 0.0;
            auVar66._20_4_ = auVar118._20_4_ * 0.0;
            auVar66._24_4_ = auVar118._24_4_ * 0.0;
            auVar66._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar66,auVar133,auVar106);
            auVar168._0_4_ = fVar140 * auVar106._0_4_;
            auVar168._4_4_ = fVar143 * auVar106._4_4_;
            auVar168._8_4_ = fVar142 * auVar106._8_4_;
            auVar168._12_4_ = fVar146 * auVar106._12_4_;
            auVar168._16_4_ = auVar106._16_4_ * 0.0;
            auVar168._20_4_ = auVar106._20_4_ * 0.0;
            auVar168._24_4_ = auVar106._24_4_ * 0.0;
            auVar168._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar168,auVar107,auVar115);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar110,ZEXT1632(auVar95));
            auVar174._0_4_ = auVar115._0_4_ * auVar133._0_4_;
            auVar174._4_4_ = auVar115._4_4_ * auVar133._4_4_;
            auVar174._8_4_ = auVar115._8_4_ * auVar133._8_4_;
            auVar174._12_4_ = auVar115._12_4_ * auVar133._12_4_;
            auVar174._16_4_ = auVar115._16_4_ * fVar177;
            auVar174._20_4_ = auVar115._20_4_ * fVar170;
            auVar174._24_4_ = auVar115._24_4_ * fVar147;
            auVar174._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar174,auVar100,auVar118);
            auVar101 = vfmadd231ps_avx512vl(auVar103,auVar110,ZEXT1632(auVar95));
            auVar103 = vmulps_avx512vl(auVar105,auVar134);
            auVar103 = vfmsub231ps_avx512vl(auVar103,auVar117,auVar136);
            auVar67._4_4_ = auVar116._4_4_ * auVar136._4_4_;
            auVar67._0_4_ = auVar116._0_4_ * auVar136._0_4_;
            auVar67._8_4_ = auVar116._8_4_ * auVar136._8_4_;
            auVar67._12_4_ = auVar116._12_4_ * auVar136._12_4_;
            auVar67._16_4_ = auVar116._16_4_ * fVar91;
            auVar67._20_4_ = auVar116._20_4_ * fVar92;
            auVar67._24_4_ = auVar116._24_4_ * fVar159;
            auVar67._28_4_ = iVar2;
            auVar95 = vfmsub231ps_fma(auVar67,auVar135,auVar105);
            auVar175._0_4_ = auVar135._0_4_ * auVar117._0_4_;
            auVar175._4_4_ = auVar135._4_4_ * auVar117._4_4_;
            auVar175._8_4_ = auVar135._8_4_ * auVar117._8_4_;
            auVar175._12_4_ = auVar135._12_4_ * auVar117._12_4_;
            auVar175._16_4_ = fVar169 * auVar117._16_4_;
            auVar175._20_4_ = fVar160 * auVar117._20_4_;
            auVar175._24_4_ = fVar178 * auVar117._24_4_;
            auVar175._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar175,auVar116,auVar134);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar110,auVar103);
            auVar108 = vfmadd231ps_avx512vl(auVar103,auVar110,ZEXT1632(auVar95));
            auVar103 = vmaxps_avx(auVar101,auVar108);
            uVar149 = vcmpps_avx512vl(auVar103,auVar110,2);
            local_410 = local_410 & (byte)uVar149;
            auVar196 = ZEXT3264(auVar114);
            if (local_410 == 0) {
LAB_01dc7893:
              local_410 = 0;
            }
            else {
              auVar68._4_4_ = auVar105._4_4_ * auVar115._4_4_;
              auVar68._0_4_ = auVar105._0_4_ * auVar115._0_4_;
              auVar68._8_4_ = auVar105._8_4_ * auVar115._8_4_;
              auVar68._12_4_ = auVar105._12_4_ * auVar115._12_4_;
              auVar68._16_4_ = auVar105._16_4_ * auVar115._16_4_;
              auVar68._20_4_ = auVar105._20_4_ * auVar115._20_4_;
              auVar68._24_4_ = auVar105._24_4_ * auVar115._24_4_;
              auVar68._28_4_ = auVar103._28_4_;
              auVar9 = vfmsub231ps_fma(auVar68,auVar116,auVar118);
              auVar69._4_4_ = auVar118._4_4_ * auVar117._4_4_;
              auVar69._0_4_ = auVar118._0_4_ * auVar117._0_4_;
              auVar69._8_4_ = auVar118._8_4_ * auVar117._8_4_;
              auVar69._12_4_ = auVar118._12_4_ * auVar117._12_4_;
              auVar69._16_4_ = auVar118._16_4_ * auVar117._16_4_;
              auVar69._20_4_ = auVar118._20_4_ * auVar117._20_4_;
              auVar69._24_4_ = auVar118._24_4_ * auVar117._24_4_;
              auVar69._28_4_ = auVar118._28_4_;
              auVar8 = vfmsub231ps_fma(auVar69,auVar106,auVar105);
              auVar70._4_4_ = auVar116._4_4_ * auVar106._4_4_;
              auVar70._0_4_ = auVar116._0_4_ * auVar106._0_4_;
              auVar70._8_4_ = auVar116._8_4_ * auVar106._8_4_;
              auVar70._12_4_ = auVar116._12_4_ * auVar106._12_4_;
              auVar70._16_4_ = auVar116._16_4_ * auVar106._16_4_;
              auVar70._20_4_ = auVar116._20_4_ * auVar106._20_4_;
              auVar70._24_4_ = auVar116._24_4_ * auVar106._24_4_;
              auVar70._28_4_ = auVar116._28_4_;
              auVar203 = vfmsub231ps_fma(auVar70,auVar117,auVar115);
              auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar8),ZEXT1632(auVar203));
              auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar9),auVar110);
              auVar115 = vrcp14ps_avx512vl(auVar103);
              auVar32._8_4_ = 0x3f800000;
              auVar32._0_8_ = &DAT_3f8000003f800000;
              auVar32._12_4_ = 0x3f800000;
              auVar32._16_4_ = 0x3f800000;
              auVar32._20_4_ = 0x3f800000;
              auVar32._24_4_ = 0x3f800000;
              auVar32._28_4_ = 0x3f800000;
              auVar118 = vfnmadd213ps_avx512vl(auVar115,auVar103,auVar32);
              auVar95 = vfmadd132ps_fma(auVar118,auVar115,auVar115);
              auVar71._4_4_ = auVar203._4_4_ * auVar133._4_4_;
              auVar71._0_4_ = auVar203._0_4_ * auVar133._0_4_;
              auVar71._8_4_ = auVar203._8_4_ * auVar133._8_4_;
              auVar71._12_4_ = auVar203._12_4_ * auVar133._12_4_;
              auVar71._16_4_ = fVar177 * 0.0;
              auVar71._20_4_ = fVar170 * 0.0;
              auVar71._24_4_ = fVar147 * 0.0;
              auVar71._28_4_ = iVar1;
              auVar8 = vfmadd231ps_fma(auVar71,auVar100,ZEXT1632(auVar8));
              auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar107,ZEXT1632(auVar9));
              fVar170 = auVar95._0_4_;
              fVar147 = auVar95._4_4_;
              fVar177 = auVar95._8_4_;
              fVar178 = auVar95._12_4_;
              auVar115 = ZEXT1632(CONCAT412(auVar8._12_4_ * fVar178,
                                            CONCAT48(auVar8._8_4_ * fVar177,
                                                     CONCAT44(auVar8._4_4_ * fVar147,
                                                              auVar8._0_4_ * fVar170))));
              auVar81._4_4_ = uStack_37c;
              auVar81._0_4_ = local_380;
              auVar81._8_4_ = uStack_378;
              auVar81._12_4_ = uStack_374;
              auVar81._16_4_ = uStack_370;
              auVar81._20_4_ = uStack_36c;
              auVar81._24_4_ = uStack_368;
              auVar81._28_4_ = uStack_364;
              uVar149 = vcmpps_avx512vl(auVar115,auVar81,0xd);
              uVar148 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar33._4_4_ = uVar148;
              auVar33._0_4_ = uVar148;
              auVar33._8_4_ = uVar148;
              auVar33._12_4_ = uVar148;
              auVar33._16_4_ = uVar148;
              auVar33._20_4_ = uVar148;
              auVar33._24_4_ = uVar148;
              auVar33._28_4_ = uVar148;
              uVar25 = vcmpps_avx512vl(auVar115,auVar33,2);
              local_410 = (byte)uVar149 & (byte)uVar25 & local_410;
              if (local_410 == 0) goto LAB_01dc7893;
              uVar149 = vcmpps_avx512vl(auVar103,auVar110,4);
              if ((local_410 & (byte)uVar149) == 0) {
                local_410 = 0;
              }
              else {
                local_410 = local_410 & (byte)uVar149;
                fVar160 = auVar101._0_4_ * fVar170;
                fVar169 = auVar101._4_4_ * fVar147;
                auVar72._4_4_ = fVar169;
                auVar72._0_4_ = fVar160;
                fVar91 = auVar101._8_4_ * fVar177;
                auVar72._8_4_ = fVar91;
                fVar92 = auVar101._12_4_ * fVar178;
                auVar72._12_4_ = fVar92;
                fVar159 = auVar101._16_4_ * 0.0;
                auVar72._16_4_ = fVar159;
                fVar139 = auVar101._20_4_ * 0.0;
                auVar72._20_4_ = fVar139;
                fVar140 = auVar101._24_4_ * 0.0;
                auVar72._24_4_ = fVar140;
                auVar72._28_4_ = auVar101._28_4_;
                fVar170 = auVar108._0_4_ * fVar170;
                fVar147 = auVar108._4_4_ * fVar147;
                auVar73._4_4_ = fVar147;
                auVar73._0_4_ = fVar170;
                fVar177 = auVar108._8_4_ * fVar177;
                auVar73._8_4_ = fVar177;
                fVar178 = auVar108._12_4_ * fVar178;
                auVar73._12_4_ = fVar178;
                fVar141 = auVar108._16_4_ * 0.0;
                auVar73._16_4_ = fVar141;
                fVar143 = auVar108._20_4_ * 0.0;
                auVar73._20_4_ = fVar143;
                fVar144 = auVar108._24_4_ * 0.0;
                auVar73._24_4_ = fVar144;
                auVar73._28_4_ = auVar108._28_4_;
                auVar183._8_4_ = 0x3f800000;
                auVar183._0_8_ = &DAT_3f8000003f800000;
                auVar183._12_4_ = 0x3f800000;
                auVar183._16_4_ = 0x3f800000;
                auVar183._20_4_ = 0x3f800000;
                auVar183._24_4_ = 0x3f800000;
                auVar183._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx512vl(auVar183,auVar72);
                bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar21 = SUB81(uVar83 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar21 * auVar101._28_4_ |
                                              (uint)!bVar21 * auVar103._28_4_,
                                              CONCAT424((uint)bVar22 * (int)fVar140 |
                                                        (uint)!bVar22 * auVar103._24_4_,
                                                        CONCAT420((uint)bVar20 * (int)fVar139 |
                                                                  (uint)!bVar20 * auVar103._20_4_,
                                                                  CONCAT416((uint)bVar19 *
                                                                            (int)fVar159 |
                                                                            (uint)!bVar19 *
                                                                            auVar103._16_4_,
                                                                            CONCAT412((uint)bVar18 *
                                                                                      (int)fVar92 |
                                                                                      (uint)!bVar18
                                                                                      * auVar103.
                                                  _12_4_,CONCAT48((uint)bVar17 * (int)fVar91 |
                                                                  (uint)!bVar17 * auVar103._8_4_,
                                                                  CONCAT44((uint)bVar16 *
                                                                           (int)fVar169 |
                                                                           (uint)!bVar16 *
                                                                           auVar103._4_4_,
                                                                           (uint)(bVar85 & 1) *
                                                                           (int)fVar160 |
                                                                           (uint)!(bool)(bVar85 & 1)
                                                                           * auVar103._0_4_))))))));
                auVar103 = vsubps_avx(auVar183,auVar73);
                bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar21 = SUB81(uVar83 >> 7,0);
                local_360._4_4_ = (uint)bVar16 * (int)fVar147 | (uint)!bVar16 * auVar103._4_4_;
                local_360._0_4_ =
                     (uint)(bVar85 & 1) * (int)fVar170 | (uint)!(bool)(bVar85 & 1) * auVar103._0_4_;
                local_360._8_4_ = (uint)bVar17 * (int)fVar177 | (uint)!bVar17 * auVar103._8_4_;
                local_360._12_4_ = (uint)bVar18 * (int)fVar178 | (uint)!bVar18 * auVar103._12_4_;
                local_360._16_4_ = (uint)bVar19 * (int)fVar141 | (uint)!bVar19 * auVar103._16_4_;
                local_360._20_4_ = (uint)bVar20 * (int)fVar143 | (uint)!bVar20 * auVar103._20_4_;
                local_360._24_4_ = (uint)bVar22 * (int)fVar144 | (uint)!bVar22 * auVar103._24_4_;
                local_360._28_4_ = (uint)bVar21 * auVar108._28_4_ | (uint)!bVar21 * auVar103._28_4_;
                in_ZMM21 = ZEXT3264(auVar115);
              }
            }
            auVar200 = ZEXT3264(local_6a0);
            if (local_410 != 0) {
              auVar103 = vsubps_avx(ZEXT1632(auVar94),auVar98);
              local_5c0 = in_ZMM20._0_32_;
              auVar103 = vfmadd213ps_avx512vl(auVar103,local_5c0,auVar98);
              auVar153._0_4_ = auVar103._0_4_ + auVar103._0_4_;
              auVar153._4_4_ = auVar103._4_4_ + auVar103._4_4_;
              auVar153._8_4_ = auVar103._8_4_ + auVar103._8_4_;
              auVar153._12_4_ = auVar103._12_4_ + auVar103._12_4_;
              auVar153._16_4_ = auVar103._16_4_ + auVar103._16_4_;
              auVar153._20_4_ = auVar103._20_4_ + auVar103._20_4_;
              auVar153._24_4_ = auVar103._24_4_ + auVar103._24_4_;
              auVar153._28_4_ = auVar103._28_4_ + auVar103._28_4_;
              uVar148 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar34._4_4_ = uVar148;
              auVar34._0_4_ = uVar148;
              auVar34._8_4_ = uVar148;
              auVar34._12_4_ = uVar148;
              auVar34._16_4_ = uVar148;
              auVar34._20_4_ = uVar148;
              auVar34._24_4_ = uVar148;
              auVar34._28_4_ = uVar148;
              auVar103 = vmulps_avx512vl(auVar153,auVar34);
              local_5e0 = in_ZMM21._0_32_;
              uVar149 = vcmpps_avx512vl(local_5e0,auVar103,6);
              local_410 = local_410 & (byte)uVar149;
              if (local_410 != 0) {
                auVar154._8_4_ = 0xbf800000;
                auVar154._0_8_ = 0xbf800000bf800000;
                auVar154._12_4_ = 0xbf800000;
                auVar154._16_4_ = 0xbf800000;
                auVar154._20_4_ = 0xbf800000;
                auVar154._24_4_ = 0xbf800000;
                auVar154._28_4_ = 0xbf800000;
                auVar35._8_4_ = 0x40000000;
                auVar35._0_8_ = 0x4000000040000000;
                auVar35._12_4_ = 0x40000000;
                auVar35._16_4_ = 0x40000000;
                auVar35._20_4_ = 0x40000000;
                auVar35._24_4_ = 0x40000000;
                auVar35._28_4_ = 0x40000000;
                local_4a0 = vfmadd132ps_avx512vl(local_360,auVar154,auVar35);
                local_360 = local_4a0;
                auVar103 = local_360;
                local_460 = (undefined4)lVar90;
                local_440 = local_6b0;
                uStack_438 = uStack_6a8;
                local_430 = local_6c0;
                uStack_428 = uStack_6b8;
                local_420 = local_660;
                uStack_418 = uStack_658;
                pGVar14 = (context->scene->geometries).items[uVar88].ptr;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar85 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar85 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar115 = vaddps_avx512vl(local_5c0,_DAT_02020f40);
                  auVar95 = vcvtsi2ss_avx512f(auVar201._0_16_,local_460);
                  fVar170 = auVar95._0_4_;
                  local_400[0] = (fVar170 + auVar115._0_4_) * (float)local_3a0._0_4_;
                  local_400[1] = (fVar170 + auVar115._4_4_) * (float)local_3a0._4_4_;
                  local_400[2] = (fVar170 + auVar115._8_4_) * fStack_398;
                  local_400[3] = (fVar170 + auVar115._12_4_) * fStack_394;
                  fStack_3f0 = (fVar170 + auVar115._16_4_) * fStack_390;
                  fStack_3ec = (fVar170 + auVar115._20_4_) * fStack_38c;
                  fStack_3e8 = (fVar170 + auVar115._24_4_) * fStack_388;
                  fStack_3e4 = fVar170 + auVar115._28_4_;
                  local_360._0_8_ = local_4a0._0_8_;
                  local_360._8_8_ = local_4a0._8_8_;
                  local_360._16_8_ = local_4a0._16_8_;
                  local_360._24_8_ = local_4a0._24_8_;
                  local_3e0 = local_360._0_8_;
                  uStack_3d8 = local_360._8_8_;
                  uStack_3d0 = local_360._16_8_;
                  uStack_3c8 = local_360._24_8_;
                  local_3c0 = local_5e0;
                  local_700._8_8_ = uStack_6a8;
                  local_700._0_8_ = local_6b0;
                  uVar83 = 0;
                  local_6d0 = (ulong)local_410;
                  for (uVar87 = local_6d0; (uVar87 & 1) == 0;
                      uVar87 = uVar87 >> 1 | 0x8000000000000000) {
                    uVar83 = uVar83 + 1;
                  }
                  local_310 = local_6c0;
                  uStack_308 = uStack_6b8;
                  local_320 = local_660;
                  uStack_318 = uStack_658;
                  local_6f0 = CONCAT44(local_6f0._4_4_,1);
                  local_4c0 = local_5c0;
                  local_480 = local_5e0;
                  local_45c = iVar13;
                  local_450 = auVar24;
                  local_360 = auVar103;
                  do {
                    local_6e0 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar170 = local_400[uVar83];
                    auVar156._4_4_ = fVar170;
                    auVar156._0_4_ = fVar170;
                    auVar156._8_4_ = fVar170;
                    auVar156._12_4_ = fVar170;
                    local_260._16_4_ = fVar170;
                    local_260._0_16_ = auVar156;
                    local_260._20_4_ = fVar170;
                    local_260._24_4_ = fVar170;
                    local_260._28_4_ = fVar170;
                    local_240 = *(undefined4 *)((long)&local_3e0 + uVar83 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar83 * 4);
                    local_730.context = context->user;
                    fVar147 = 1.0 - fVar170;
                    auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar170 * (fVar147 + fVar147))),
                                              ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                    auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar156,
                                              ZEXT416(0xc0a00000));
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * 3.0)),
                                              ZEXT416((uint)(fVar170 + fVar170)),auVar95);
                    auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar156,
                                              ZEXT416(0x40000000));
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * -3.0)),
                                              ZEXT416((uint)(fVar147 + fVar147)),auVar95);
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),auVar156,
                                             ZEXT416((uint)(fVar147 * -2.0)));
                    fVar170 = auVar9._0_4_ * 0.5;
                    fVar147 = auVar94._0_4_ * 0.5;
                    fVar177 = auVar95._0_4_ * 0.5;
                    fVar178 = auVar8._0_4_ * 0.5;
                    auVar164._0_4_ = fVar178 * (float)local_320;
                    auVar164._4_4_ = fVar178 * local_320._4_4_;
                    auVar164._8_4_ = fVar178 * (float)uStack_318;
                    auVar164._12_4_ = fVar178 * uStack_318._4_4_;
                    auVar180._4_4_ = fVar177;
                    auVar180._0_4_ = fVar177;
                    auVar180._8_4_ = fVar177;
                    auVar180._12_4_ = fVar177;
                    auVar82._8_8_ = uStack_308;
                    auVar82._0_8_ = local_310;
                    auVar95 = vfmadd132ps_fma(auVar180,auVar164,auVar82);
                    auVar165._4_4_ = fVar147;
                    auVar165._0_4_ = fVar147;
                    auVar165._8_4_ = fVar147;
                    auVar165._12_4_ = fVar147;
                    auVar95 = vfmadd132ps_fma(auVar165,auVar95,local_700);
                    auVar151._4_4_ = fVar170;
                    auVar151._0_4_ = fVar170;
                    auVar151._8_4_ = fVar170;
                    auVar151._12_4_ = fVar170;
                    auVar95 = vfmadd213ps_fma(auVar151,auVar24,auVar95);
                    local_2c0 = auVar95._0_4_;
                    auVar176._8_4_ = 1;
                    auVar176._0_8_ = 0x100000001;
                    auVar176._12_4_ = 1;
                    auVar176._16_4_ = 1;
                    auVar176._20_4_ = 1;
                    auVar176._24_4_ = 1;
                    auVar176._28_4_ = 1;
                    local_2a0 = vpermps_avx2(auVar176,ZEXT1632(auVar95));
                    auVar184._8_4_ = 2;
                    auVar184._0_8_ = 0x200000002;
                    auVar184._12_4_ = 2;
                    auVar184._16_4_ = 2;
                    auVar184._20_4_ = 2;
                    auVar184._24_4_ = 2;
                    auVar184._28_4_ = 2;
                    local_280 = vpermps_avx2(auVar184,ZEXT1632(auVar95));
                    uStack_2bc = local_2c0;
                    uStack_2b8 = local_2c0;
                    uStack_2b4 = local_2c0;
                    uStack_2b0 = local_2c0;
                    uStack_2ac = local_2c0;
                    uStack_2a8 = local_2c0;
                    uStack_2a4 = local_2c0;
                    uStack_23c = local_240;
                    uStack_238 = local_240;
                    uStack_234 = local_240;
                    uStack_230 = local_240;
                    uStack_22c = local_240;
                    uStack_228 = local_240;
                    uStack_224 = local_240;
                    local_220 = local_520._0_8_;
                    uStack_218 = local_520._8_8_;
                    uStack_210 = local_520._16_8_;
                    uStack_208 = local_520._24_8_;
                    local_200 = local_4e0;
                    vpcmpeqd_avx2(local_4e0,local_4e0);
                    local_1e0 = (local_730.context)->instID[0];
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = (local_730.context)->instPrimID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_680 = local_300._0_8_;
                    uStack_678 = local_300._8_8_;
                    uStack_670 = local_300._16_8_;
                    uStack_668 = local_300._24_8_;
                    local_730.valid = (int *)&local_680;
                    local_730.geometryUserPtr = pGVar14->userPtr;
                    local_730.hit = (RTCHitN *)&local_2c0;
                    local_730.N = 8;
                    pRVar84 = (RayK<8> *)pGVar14->occlusionFilterN;
                    local_540._0_8_ = uVar83;
                    uVar87 = uVar83;
                    local_730.ray = (RTCRayN *)ray;
                    if (pRVar84 != (RayK<8> *)0x0) {
                      pRVar84 = (RayK<8> *)(*(code *)pRVar84)(&local_730);
                      uVar87 = local_540._0_8_;
                    }
                    auVar78._8_8_ = uStack_678;
                    auVar78._0_8_ = local_680;
                    auVar78._16_8_ = uStack_670;
                    auVar78._24_8_ = uStack_668;
                    if (auVar78 != (undefined1  [32])0x0) {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_730);
                        uVar87 = local_540._0_8_;
                      }
                      auVar95 = auVar204._0_16_;
                      auVar79._8_8_ = uStack_678;
                      auVar79._0_8_ = local_680;
                      auVar79._16_8_ = uStack_670;
                      auVar79._24_8_ = uStack_668;
                      uVar83 = vptestmd_avx512vl(auVar79,auVar79);
                      auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar16 = (bool)((byte)uVar83 & 1);
                      auVar138._0_4_ =
                           (uint)bVar16 * auVar103._0_4_ |
                           (uint)!bVar16 * *(int *)(local_730.ray + 0x100);
                      bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                      auVar138._4_4_ =
                           (uint)bVar16 * auVar103._4_4_ |
                           (uint)!bVar16 * *(int *)(local_730.ray + 0x104);
                      bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
                      auVar138._8_4_ =
                           (uint)bVar16 * auVar103._8_4_ |
                           (uint)!bVar16 * *(int *)(local_730.ray + 0x108);
                      bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
                      auVar138._12_4_ =
                           (uint)bVar16 * auVar103._12_4_ |
                           (uint)!bVar16 * *(int *)(local_730.ray + 0x10c);
                      bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                      auVar138._16_4_ =
                           (uint)bVar16 * auVar103._16_4_ |
                           (uint)!bVar16 * *(int *)(local_730.ray + 0x110);
                      bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
                      auVar138._20_4_ =
                           (uint)bVar16 * auVar103._20_4_ |
                           (uint)!bVar16 * *(int *)(local_730.ray + 0x114);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      auVar138._24_4_ =
                           (uint)bVar16 * auVar103._24_4_ |
                           (uint)!bVar16 * *(int *)(local_730.ray + 0x118);
                      bVar16 = SUB81(uVar83 >> 7,0);
                      auVar138._28_4_ =
                           (uint)bVar16 * auVar103._28_4_ |
                           (uint)!bVar16 * *(int *)(local_730.ray + 0x11c);
                      *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar138;
                      pRVar84 = (RayK<8> *)local_730.ray;
                      if (auVar79 != (undefined1  [32])0x0) break;
                    }
                    auVar95 = auVar204._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_6e0;
                    uVar83 = 0;
                    local_6d0 = local_6d0 ^ 1L << (uVar87 & 0x3f);
                    for (uVar87 = local_6d0; (uVar87 & 1) == 0;
                        uVar87 = uVar87 >> 1 | 0x8000000000000000) {
                      uVar83 = uVar83 + 1;
                    }
                    local_6f0 = CONCAT44(local_6f0._4_4_,
                                         (int)CONCAT71((int7)((ulong)pRVar84 >> 8),local_6d0 != 0));
                  } while (local_6d0 != 0);
                  bVar85 = (byte)local_6f0 & 1;
                  auVar95 = vxorps_avx512vl(auVar95,auVar95);
                  auVar204 = ZEXT1664(auVar95);
                  in_ZMM20 = ZEXT3264(local_5c0);
                  in_ZMM21 = ZEXT3264(local_5e0);
                  auVar202 = ZEXT3264(local_560);
                  auVar196 = ZEXT3264(local_580);
                  auVar200 = ZEXT3264(local_6a0);
                  auVar205 = ZEXT3264(local_600);
                  auVar206 = ZEXT3264(local_620);
                }
                bVar86 = (bool)(bVar86 | bVar85);
              }
            }
          }
          auVar185 = ZEXT3264(auVar102);
          auVar158 = ZEXT3264(auVar104);
          lVar90 = lVar90 + 8;
          auVar201 = auVar196;
        } while ((int)lVar90 < iVar13);
      }
      if (bVar86 != false) {
        return local_7b9;
      }
      uVar148 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar148;
      auVar31._0_4_ = uVar148;
      auVar31._8_4_ = uVar148;
      auVar31._12_4_ = uVar148;
      auVar31._16_4_ = uVar148;
      auVar31._20_4_ = uVar148;
      auVar31._24_4_ = uVar148;
      auVar31._28_4_ = uVar148;
      uVar149 = vcmpps_avx512vl(local_80,auVar31,2);
      uVar88 = (uint)uVar89 & (uint)uVar149;
      uVar89 = (ulong)uVar88;
      local_7b9 = uVar88 != 0;
    } while (local_7b9);
  }
  return local_7b9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }